

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar75 [16];
  undefined1 auVar108 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  int iVar123;
  undefined4 uVar124;
  vint4 bi_2;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  vint4 bi_1;
  undefined1 auVar129 [16];
  vint4 bi;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  float fVar137;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  vfloat4 b0;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  float fVar152;
  float fVar161;
  float fVar162;
  vint4 ai;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar163;
  undefined1 auVar160 [32];
  vint4 ai_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  vint4 ai_2;
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  __m128 a;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  vfloat4 a0_2;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  float fVar207;
  float fVar217;
  float fVar219;
  vfloat4 a0_3;
  undefined1 auVar208 [16];
  float fVar218;
  float fVar220;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar235;
  vfloat4 b0_2;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  vfloat4 b0_3;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar263 [64];
  undefined1 auVar264 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_378 [16];
  long local_368;
  Primitive *local_360;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_e8 [16];
  undefined1 local_d8 [16];
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  undefined1 auVar122 [32];
  float fVar146;
  undefined1 auVar246 [32];
  
  uVar21 = (ulong)(byte)prim[1];
  auVar45 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 4 + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 5 + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 6 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0xf + 6)));
  lVar25 = uVar21 * 0x25;
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x11 + 6)));
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1a + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1b + 6)));
  auVar48 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar21 * 0x1c + 6)));
  auVar109._16_16_ = in_YmmResult._16_16_;
  auVar34 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(prim + lVar25 + 0x12)));
  auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar49 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar35 = vsubps_avx512vl(auVar49,*(undefined1 (*) [16])(prim + lVar25 + 6));
  fVar152 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar25 + 0x16)) *
            *(float *)(prim + lVar25 + 0x1a);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar21 * 7 + 6);
  auVar70 = vpmovsxwd_avx(auVar49);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar21 * 0xb + 6);
  auVar53 = vpmovsxwd_avx(auVar52);
  auVar36 = vpbroadcastd_avx512vl();
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar21 * 9 + 6);
  auVar37 = vpmovsxwd_avx512vl(auVar51);
  auVar255 = ZEXT1664(auVar37);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar21 * 0xd + 6);
  auVar38 = vpmovsxwd_avx512vl(auVar50);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + uVar21 * 0x12 + 6);
  auVar55 = vpmovsxwd_avx(auVar55);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar21 * 0x16 + 6);
  auVar54 = vpmovsxwd_avx(auVar54);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar21 * 0x14 + 6);
  auVar58 = vpmovsxwd_avx(auVar58);
  auVar49 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar49 = vinsertps_avx512f(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar35 = vmulps_avx512vl(auVar34,auVar35);
  auVar34 = vmulps_avx512vl(auVar34,auVar49);
  auVar39 = vcvtdq2ps_avx512vl(auVar45);
  auVar40 = vcvtdq2ps_avx512vl(auVar40);
  auVar259 = ZEXT1664(auVar40);
  auVar41 = vcvtdq2ps_avx512vl(auVar41);
  auVar42 = vcvtdq2ps_avx512vl(auVar42);
  auVar43 = vcvtdq2ps_avx512vl(auVar43);
  auVar49 = vcvtdq2ps_avx(auVar44);
  auVar52 = vcvtdq2ps_avx(auVar46);
  auVar51 = vcvtdq2ps_avx(auVar47);
  auVar50 = vcvtdq2ps_avx(auVar48);
  auVar44 = vbroadcastss_avx512vl(auVar34);
  auVar45 = vshufps_avx512vl(auVar34,auVar34,0x55);
  auVar46 = vshufps_avx512vl(auVar34,auVar34,0xaa);
  auVar47 = vmulps_avx512vl(auVar46,auVar41);
  auVar60._0_4_ = auVar46._0_4_ * auVar49._0_4_;
  auVar60._4_4_ = auVar46._4_4_ * auVar49._4_4_;
  auVar60._8_4_ = auVar46._8_4_ * auVar49._8_4_;
  auVar60._12_4_ = auVar46._12_4_ * auVar49._12_4_;
  auVar34._0_4_ = auVar50._0_4_ * auVar46._0_4_;
  auVar34._4_4_ = auVar50._4_4_ * auVar46._4_4_;
  auVar34._8_4_ = auVar50._8_4_ * auVar46._8_4_;
  auVar34._12_4_ = auVar50._12_4_ * auVar46._12_4_;
  auVar46 = vfmadd231ps_avx512vl(auVar47,auVar45,auVar40);
  auVar47 = vfmadd231ps_avx512vl(auVar60,auVar45,auVar43);
  auVar45 = vfmadd231ps_fma(auVar34,auVar51,auVar45);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar44,auVar39);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar44,auVar42);
  auVar45 = vfmadd231ps_fma(auVar45,auVar52,auVar44);
  auVar44 = vbroadcastss_avx512vl(auVar35);
  auVar48 = vshufps_avx512vl(auVar35,auVar35,0x55);
  auVar34 = vshufps_avx512vl(auVar35,auVar35,0xaa);
  auVar41 = vmulps_avx512vl(auVar34,auVar41);
  auVar49 = vmulps_avx512vl(auVar34,auVar49);
  auVar50 = vmulps_avx512vl(auVar34,auVar50);
  auVar40 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar40);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar48,auVar43);
  auVar51 = vfmadd231ps_avx512vl(auVar50,auVar48,auVar51);
  auVar35 = vfmadd231ps_avx512vl(auVar40,auVar44,auVar39);
  auVar39 = vfmadd231ps_avx512vl(auVar49,auVar44,auVar42);
  auVar34 = vfmadd231ps_fma(auVar51,auVar44,auVar52);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar262 = ZEXT1664(auVar49);
  auVar52 = vandps_avx512vl(auVar46,auVar49);
  auVar63._8_4_ = 0x219392ef;
  auVar63._0_8_ = 0x219392ef219392ef;
  auVar63._12_4_ = 0x219392ef;
  uVar26 = vcmpps_avx512vl(auVar52,auVar63,1);
  bVar28 = (bool)((byte)uVar26 & 1);
  auVar56._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar46._0_4_;
  bVar28 = (bool)((byte)(uVar26 >> 1) & 1);
  auVar56._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar46._4_4_;
  bVar28 = (bool)((byte)(uVar26 >> 2) & 1);
  auVar56._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar46._8_4_;
  bVar28 = (bool)((byte)(uVar26 >> 3) & 1);
  auVar56._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar46._12_4_;
  auVar52 = vandps_avx512vl(auVar47,auVar49);
  uVar26 = vcmpps_avx512vl(auVar52,auVar63,1);
  bVar28 = (bool)((byte)uVar26 & 1);
  auVar57._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar47._0_4_;
  bVar28 = (bool)((byte)(uVar26 >> 1) & 1);
  auVar57._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar47._4_4_;
  bVar28 = (bool)((byte)(uVar26 >> 2) & 1);
  auVar57._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar47._8_4_;
  bVar28 = (bool)((byte)(uVar26 >> 3) & 1);
  auVar57._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar47._12_4_;
  auVar49 = vandps_avx512vl(auVar45,auVar49);
  uVar26 = vcmpps_avx512vl(auVar49,auVar63,1);
  bVar28 = (bool)((byte)uVar26 & 1);
  auVar59._0_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._0_4_;
  bVar28 = (bool)((byte)(uVar26 >> 1) & 1);
  auVar59._4_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._4_4_;
  bVar28 = (bool)((byte)(uVar26 >> 2) & 1);
  auVar59._8_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._8_4_;
  bVar28 = (bool)((byte)(uVar26 >> 3) & 1);
  auVar59._12_4_ = (uint)bVar28 * 0x219392ef | (uint)!bVar28 * auVar45._12_4_;
  auVar52 = vrcp14ps_avx512vl(auVar56);
  auVar64._8_4_ = 0x3f800000;
  auVar64._0_8_ = 0x3f8000003f800000;
  auVar64._12_4_ = 0x3f800000;
  auVar49 = vfnmadd213ps_fma(auVar56,auVar52,auVar64);
  auVar50 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar52 = vrcp14ps_avx512vl(auVar57);
  auVar49 = vfnmadd213ps_fma(auVar57,auVar52,auVar64);
  auVar44 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar52 = vrcp14ps_avx512vl(auVar59);
  auVar49 = vfnmadd213ps_fma(auVar59,auVar52,auVar64);
  auVar46 = vfmadd132ps_fma(auVar49,auVar52,auVar52);
  auVar61._4_4_ = fVar152;
  auVar61._0_4_ = fVar152;
  auVar61._8_4_ = fVar152;
  auVar61._12_4_ = fVar152;
  auVar49 = vcvtdq2ps_avx(auVar70);
  auVar52 = vcvtdq2ps_avx(auVar53);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar47 = vfmadd213ps_fma(auVar52,auVar61,auVar49);
  auVar52 = vcvtdq2ps_avx512vl(auVar37);
  auVar49 = vcvtdq2ps_avx512vl(auVar38);
  auVar49 = vsubps_avx(auVar49,auVar52);
  auVar48 = vfmadd213ps_fma(auVar49,auVar61,auVar52);
  auVar49 = vcvtdq2ps_avx(auVar55);
  auVar52 = vcvtdq2ps_avx(auVar54);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar55 = vfmadd213ps_fma(auVar52,auVar61,auVar49);
  auVar49 = vcvtdq2ps_avx(auVar58);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar21 * 0x18 + 6);
  auVar52 = vpmovsxwd_avx(auVar45);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar51 = vsubps_avx(auVar52,auVar49);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar21 * 0x1d + 6);
  auVar52 = vpmovsxwd_avx(auVar40);
  auVar51 = vfmadd213ps_fma(auVar51,auVar61,auVar49);
  auVar49 = vcvtdq2ps_avx(auVar52);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar21 * 0x21 + 6);
  auVar52 = vpmovsxwd_avx(auVar41);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar54 = vfmadd213ps_fma(auVar52,auVar61,auVar49);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar21 * 0x1f + 6);
  auVar49 = vpmovsxwd_avx(auVar42);
  auVar49 = vcvtdq2ps_avx(auVar49);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar21 * 0x23 + 6);
  auVar52 = vpmovsxwd_avx(auVar43);
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar52 = vsubps_avx(auVar52,auVar49);
  auVar52 = vfmadd213ps_fma(auVar52,auVar61,auVar49);
  auVar49 = vsubps_avx512vl(auVar47,auVar35);
  auVar37._0_4_ = auVar50._0_4_ * auVar49._0_4_;
  auVar37._4_4_ = auVar50._4_4_ * auVar49._4_4_;
  auVar37._8_4_ = auVar50._8_4_ * auVar49._8_4_;
  auVar37._12_4_ = auVar50._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx512vl(auVar48,auVar35);
  auVar35._0_4_ = auVar50._0_4_ * auVar49._0_4_;
  auVar35._4_4_ = auVar50._4_4_ * auVar49._4_4_;
  auVar35._8_4_ = auVar50._8_4_ * auVar49._8_4_;
  auVar35._12_4_ = auVar50._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar55,auVar39);
  auVar62._0_4_ = auVar44._0_4_ * auVar49._0_4_;
  auVar62._4_4_ = auVar44._4_4_ * auVar49._4_4_;
  auVar62._8_4_ = auVar44._8_4_ * auVar49._8_4_;
  auVar62._12_4_ = auVar44._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar51,auVar39);
  auVar53._0_4_ = auVar44._0_4_ * auVar49._0_4_;
  auVar53._4_4_ = auVar44._4_4_ * auVar49._4_4_;
  auVar53._8_4_ = auVar44._8_4_ * auVar49._8_4_;
  auVar53._12_4_ = auVar44._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar54,auVar34);
  auVar39._0_4_ = auVar46._0_4_ * auVar49._0_4_;
  auVar39._4_4_ = auVar46._4_4_ * auVar49._4_4_;
  auVar39._8_4_ = auVar46._8_4_ * auVar49._8_4_;
  auVar39._12_4_ = auVar46._12_4_ * auVar49._12_4_;
  auVar49 = vsubps_avx(auVar52,auVar34);
  auVar70._0_4_ = auVar46._0_4_ * auVar49._0_4_;
  auVar70._4_4_ = auVar46._4_4_ * auVar49._4_4_;
  auVar70._8_4_ = auVar46._8_4_ * auVar49._8_4_;
  auVar70._12_4_ = auVar46._12_4_ * auVar49._12_4_;
  auVar49 = vpminsd_avx(auVar37,auVar35);
  auVar52 = vpminsd_avx(auVar62,auVar53);
  auVar49 = vmaxps_avx(auVar49,auVar52);
  auVar52 = vpminsd_avx(auVar39,auVar70);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar44._4_4_ = uVar124;
  auVar44._0_4_ = uVar124;
  auVar44._8_4_ = uVar124;
  auVar44._12_4_ = uVar124;
  auVar52 = vmaxps_avx512vl(auVar52,auVar44);
  auVar49 = vmaxps_avx(auVar49,auVar52);
  auVar46._8_4_ = 0x3f7ffffa;
  auVar46._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar46._12_4_ = 0x3f7ffffa;
  auVar51 = vmulps_avx512vl(auVar49,auVar46);
  auVar49 = vpmaxsd_avx(auVar37,auVar35);
  auVar52 = vpmaxsd_avx(auVar62,auVar53);
  auVar49 = vminps_avx(auVar49,auVar52);
  auVar52 = vpmaxsd_avx(auVar39,auVar70);
  uVar124 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar47._4_4_ = uVar124;
  auVar47._0_4_ = uVar124;
  auVar47._8_4_ = uVar124;
  auVar47._12_4_ = uVar124;
  auVar52 = vminps_avx512vl(auVar52,auVar47);
  auVar49 = vminps_avx(auVar49,auVar52);
  auVar48._8_4_ = 0x3f800003;
  auVar48._0_8_ = 0x3f8000033f800003;
  auVar48._12_4_ = 0x3f800003;
  auVar49 = vmulps_avx512vl(auVar49,auVar48);
  uVar14 = vcmpps_avx512vl(auVar51,auVar49,2);
  uVar15 = vpcmpgtd_avx512vl(auVar36,_DAT_01f4ad30);
  uVar26 = (ulong)((byte)uVar14 & 0xf & (byte)uVar15);
  auVar49 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar52 = vpxord_avx512vl(auVar38,auVar38);
  auVar256 = ZEXT1664(auVar52);
  auVar52 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar261 = ZEXT1664(auVar52);
  local_360 = prim;
LAB_018be47c:
  if (uVar26 == 0) {
LAB_018c0344:
    return uVar26 != 0;
  }
  lVar25 = 0;
  for (uVar21 = uVar26; (uVar21 & 1) == 0; uVar21 = uVar21 >> 1 | 0x8000000000000000) {
    lVar25 = lVar25 + 1;
  }
  uVar5 = *(uint *)(local_360 + 2);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  fVar152 = (pGVar7->time_range).lower;
  fVar152 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar152) / ((pGVar7->time_range).upper - fVar152));
  auVar52 = vroundss_avx(ZEXT416((uint)fVar152),ZEXT416((uint)fVar152),9);
  auVar50 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar52 = vminss_avx(auVar52,auVar50);
  auVar37 = auVar256._0_16_;
  auVar53 = vmaxss_avx512f(auVar37,auVar52);
  uVar21 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(local_360 + lVar25 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar27 = (long)(int)auVar53._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar27);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar27);
  auVar52 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar21);
  lVar25 = uVar21 + 1;
  auVar50 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar25);
  lVar22 = uVar21 + 2;
  auVar55 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar22);
  lVar1 = uVar21 + 3;
  auVar54 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar27);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar27);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar21);
  auVar45 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
  auVar40 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar22);
  auVar41 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar27);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar27);
  auVar42 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar21);
  auVar43 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar25);
  auVar44 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar22);
  auVar46 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar38 = vpbroadcastd_avx512vl();
  lVar10 = *(long *)(lVar9 + 0x38 + lVar27);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar27);
  auVar47 = *(undefined1 (*) [16])(lVar10 + uVar21 * lVar9);
  auVar48 = *(undefined1 (*) [16])(lVar10 + lVar25 * lVar9);
  auVar70 = *(undefined1 (*) [16])(lVar10 + lVar22 * lVar9);
  auVar53 = vsubss_avx512f(ZEXT416((uint)fVar152),auVar53);
  auVar89._0_16_ = vxorps_avx512vl(auVar259._0_16_,auVar259._0_16_);
  auVar34 = vmulps_avx512vl(auVar54,auVar89._0_16_);
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar55,auVar89._0_16_);
  auVar35 = vpxord_avx512vl(auVar255._0_16_,auVar255._0_16_);
  auVar35 = vfmadd213ps_avx512vl(auVar35,auVar50,auVar34);
  auVar35 = vaddps_avx512vl(auVar52,auVar35);
  auVar59 = auVar261._0_16_;
  auVar34 = vfmadd231ps_avx512vl(auVar34,auVar50,auVar59);
  auVar34 = vfnmadd231ps_avx512vl(auVar34,auVar52,auVar59);
  auVar36 = vmulps_avx512vl(auVar41,auVar89._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar40,auVar89._0_16_);
  auVar37 = vxorps_avx512vl(auVar37,auVar37);
  auVar37 = vfmadd213ps_avx512vl(auVar37,auVar45,auVar36);
  auVar39 = vaddps_avx512vl(auVar58,auVar37);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar45,auVar59);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar58,auVar59);
  auVar37 = vxorps_avx512vl(auVar37,auVar37);
  auVar37 = vfmadd213ps_avx512vl(auVar37,auVar55,auVar54);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar50,auVar89._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar37,auVar52,auVar89._0_16_);
  auVar54 = vmulps_avx512vl(auVar54,auVar59);
  auVar55 = vfnmadd231ps_avx512vl(auVar54,auVar59,auVar55);
  auVar50 = vfmadd231ps_avx512vl(auVar55,auVar89._0_16_,auVar50);
  auVar56 = vfnmadd231ps_avx512vl(auVar50,auVar89._0_16_,auVar52);
  auVar52 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar40,auVar41);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar45,auVar89._0_16_);
  auVar57 = vfmadd231ps_avx512vl(auVar52,auVar58,auVar89._0_16_);
  auVar52 = vmulps_avx512vl(auVar41,auVar59);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar59,auVar40);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar89._0_16_,auVar45);
  auVar45 = vfnmadd231ps_avx512vl(auVar52,auVar89._0_16_,auVar58);
  auVar52 = vshufps_avx(auVar34,auVar34,0xc9);
  auVar50 = vshufps_avx512vl(auVar39,auVar39,0xc9);
  fVar137 = auVar34._0_4_;
  auVar78._0_4_ = fVar137 * auVar50._0_4_;
  fVar143 = auVar34._4_4_;
  auVar78._4_4_ = fVar143 * auVar50._4_4_;
  fVar144 = auVar34._8_4_;
  auVar78._8_4_ = fVar144 * auVar50._8_4_;
  fVar145 = auVar34._12_4_;
  auVar78._12_4_ = fVar145 * auVar50._12_4_;
  auVar50 = vfmsub231ps_avx512vl(auVar78,auVar52,auVar39);
  auVar55 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx512vl(auVar36,auVar36,0xc9);
  auVar85._0_4_ = fVar137 * auVar50._0_4_;
  auVar85._4_4_ = fVar143 * auVar50._4_4_;
  auVar85._8_4_ = fVar144 * auVar50._8_4_;
  auVar85._12_4_ = fVar145 * auVar50._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar85,auVar52,auVar36);
  auVar54 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar50 = vshufps_avx(auVar57,auVar57,0xc9);
  fVar152 = auVar56._0_4_;
  auVar178._0_4_ = auVar50._0_4_ * fVar152;
  fVar13 = auVar56._4_4_;
  auVar178._4_4_ = auVar50._4_4_ * fVar13;
  fVar223 = auVar56._8_4_;
  auVar178._8_4_ = auVar50._8_4_ * fVar223;
  fVar207 = auVar56._12_4_;
  auVar178._12_4_ = auVar50._12_4_ * fVar207;
  auVar50 = vfmsub231ps_fma(auVar178,auVar52,auVar57);
  auVar58 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar179._0_4_ = auVar50._0_4_ * fVar152;
  auVar179._4_4_ = auVar50._4_4_ * fVar13;
  auVar179._8_4_ = auVar50._8_4_ * fVar223;
  auVar179._12_4_ = auVar50._12_4_ * fVar207;
  auVar52 = vfmsub231ps_fma(auVar179,auVar52,auVar45);
  auVar45 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar52 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar89._16_16_ = auVar109._16_16_;
  auVar90._4_28_ = auVar89._4_28_;
  auVar90._0_4_ = auVar52._0_4_;
  auVar50 = vrsqrt14ss_avx512f(auVar89._0_16_,auVar90._0_16_);
  auVar40 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  auVar41 = vmulss_avx512f(auVar41,auVar50);
  auVar50 = vmulss_avx512f(auVar41,ZEXT416((uint)(auVar50._0_4_ * auVar50._0_4_)));
  auVar50 = vsubss_avx512f(auVar40,auVar50);
  auVar189._0_4_ = auVar50._0_4_;
  auVar189._4_4_ = auVar189._0_4_;
  auVar189._8_4_ = auVar189._0_4_;
  auVar189._12_4_ = auVar189._0_4_;
  auVar40 = vmulps_avx512vl(auVar55,auVar189);
  auVar50 = vdpps_avx(auVar55,auVar54,0x7f);
  auVar41 = vbroadcastss_avx512vl(auVar52);
  auVar54 = vmulps_avx512vl(auVar41,auVar54);
  fVar218 = auVar50._0_4_;
  auVar79._0_4_ = fVar218 * auVar55._0_4_;
  auVar79._4_4_ = fVar218 * auVar55._4_4_;
  auVar79._8_4_ = fVar218 * auVar55._8_4_;
  auVar79._12_4_ = fVar218 * auVar55._12_4_;
  auVar55 = vsubps_avx(auVar54,auVar79);
  auVar50 = vrcp14ss_avx512f(auVar89._0_16_,auVar90._0_16_);
  auVar52 = vfnmadd213ss_avx512f(auVar52,auVar50,ZEXT416(0x40000000));
  fVar218 = auVar50._0_4_ * auVar52._0_4_;
  auVar52 = vdpps_avx(auVar58,auVar58,0x7f);
  auVar98._16_16_ = auVar109._16_16_;
  auVar98._0_16_ = auVar89._0_16_;
  auVar107._4_28_ = auVar98._4_28_;
  auVar107._0_4_ = auVar52._0_4_;
  auVar50 = vrsqrt14ss_avx512f(auVar89._0_16_,auVar107._0_16_);
  auVar54 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  fVar219 = auVar50._0_4_;
  fVar146 = auVar54._0_4_ - auVar41._0_4_ * fVar219 * fVar219 * fVar219;
  auVar190._0_4_ = fVar146 * auVar58._0_4_;
  auVar190._4_4_ = fVar146 * auVar58._4_4_;
  auVar190._8_4_ = fVar146 * auVar58._8_4_;
  auVar190._12_4_ = fVar146 * auVar58._12_4_;
  auVar50 = vdpps_avx(auVar58,auVar45,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar52);
  auVar54 = vmulps_avx512vl(auVar54,auVar45);
  fVar219 = auVar50._0_4_;
  auVar65._0_4_ = fVar219 * auVar58._0_4_;
  auVar65._4_4_ = fVar219 * auVar58._4_4_;
  auVar65._8_4_ = fVar219 * auVar58._8_4_;
  auVar65._12_4_ = fVar219 * auVar58._12_4_;
  auVar50 = vsubps_avx(auVar54,auVar65);
  auVar54 = vrcp14ss_avx512f(auVar89._0_16_,auVar107._0_16_);
  auVar52 = vfnmadd213ss_avx512f(auVar52,auVar54,ZEXT416(0x40000000));
  fVar219 = auVar54._0_4_ * auVar52._0_4_;
  auVar54 = vshufps_avx512vl(auVar35,auVar35,0xff);
  auVar58 = vmulps_avx512vl(auVar54,auVar40);
  auVar45 = vsubps_avx512vl(auVar35,auVar58);
  auVar52 = vshufps_avx(auVar34,auVar34,0xff);
  auVar52 = vmulps_avx512vl(auVar52,auVar40);
  auVar84._0_4_ = auVar52._0_4_ + auVar54._0_4_ * auVar189._0_4_ * fVar218 * auVar55._0_4_;
  auVar84._4_4_ = auVar52._4_4_ + auVar54._4_4_ * auVar189._0_4_ * fVar218 * auVar55._4_4_;
  auVar84._8_4_ = auVar52._8_4_ + auVar54._8_4_ * auVar189._0_4_ * fVar218 * auVar55._8_4_;
  auVar84._12_4_ = auVar52._12_4_ + auVar54._12_4_ * auVar189._0_4_ * fVar218 * auVar55._12_4_;
  auVar52 = vsubps_avx(auVar34,auVar84);
  auVar40 = vaddps_avx512vl(auVar35,auVar58);
  auVar55 = vshufps_avx512vl(auVar37,auVar37,0xff);
  auVar225._0_4_ = auVar190._0_4_ * auVar55._0_4_;
  auVar225._4_4_ = auVar190._4_4_ * auVar55._4_4_;
  auVar225._8_4_ = auVar190._8_4_ * auVar55._8_4_;
  auVar225._12_4_ = auVar190._12_4_ * auVar55._12_4_;
  auVar41 = vsubps_avx512vl(auVar37,auVar225);
  auVar54 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar58 = vmulps_avx512vl(auVar54,auVar190);
  auVar83._0_4_ = auVar58._0_4_ + auVar55._0_4_ * fVar146 * auVar50._0_4_ * fVar219;
  auVar83._4_4_ = auVar58._4_4_ + auVar55._4_4_ * fVar146 * auVar50._4_4_ * fVar219;
  auVar83._8_4_ = auVar58._8_4_ + auVar55._8_4_ * fVar146 * auVar50._8_4_ * fVar219;
  auVar83._12_4_ = auVar58._12_4_ + auVar55._12_4_ * fVar146 * auVar50._12_4_ * fVar219;
  auVar50 = vsubps_avx(auVar56,auVar83);
  auVar34 = vaddps_avx512vl(auVar37,auVar225);
  auVar173._0_4_ = auVar45._0_4_ + auVar52._0_4_ * 0.33333334;
  auVar173._4_4_ = auVar45._4_4_ + auVar52._4_4_ * 0.33333334;
  auVar173._8_4_ = auVar45._8_4_ + auVar52._8_4_ * 0.33333334;
  auVar173._12_4_ = auVar45._12_4_ + auVar52._12_4_ * 0.33333334;
  auVar88._0_4_ = auVar50._0_4_ * 0.33333334;
  auVar88._4_4_ = auVar50._4_4_ * 0.33333334;
  auVar88._8_4_ = auVar50._8_4_ * 0.33333334;
  auVar88._12_4_ = auVar50._12_4_ * 0.33333334;
  auVar58 = vsubps_avx(auVar41,auVar88);
  auVar81._0_4_ = (fVar137 + auVar84._0_4_) * 0.33333334;
  auVar81._4_4_ = (fVar143 + auVar84._4_4_) * 0.33333334;
  auVar81._8_4_ = (fVar144 + auVar84._8_4_) * 0.33333334;
  auVar81._12_4_ = (fVar145 + auVar84._12_4_) * 0.33333334;
  auVar35 = vaddps_avx512vl(auVar40,auVar81);
  auVar86._0_4_ = (fVar152 + auVar83._0_4_) * 0.33333334;
  auVar86._4_4_ = (fVar13 + auVar83._4_4_) * 0.33333334;
  auVar86._8_4_ = (fVar223 + auVar83._8_4_) * 0.33333334;
  auVar86._12_4_ = (fVar207 + auVar83._12_4_) * 0.33333334;
  auVar36 = vsubps_avx512vl(auVar34,auVar86);
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar1);
  auVar50 = vmulps_avx512vl(auVar46,auVar89._0_16_);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar44,auVar89._0_16_);
  auVar55 = vxorps_avx512vl(auVar54,auVar54);
  auVar55 = vfmadd213ps_avx512vl(auVar55,auVar43,auVar50);
  auVar39 = vaddps_avx512vl(auVar42,auVar55);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar43,auVar59);
  auVar56 = vfnmadd231ps_avx512vl(auVar50,auVar42,auVar59);
  auVar50 = vmulps_avx512vl(auVar52,auVar89._0_16_);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar70,auVar89._0_16_);
  auVar55 = vxorps_avx512vl(auVar37,auVar37);
  auVar55 = vfmadd213ps_avx512vl(auVar55,auVar48,auVar50);
  auVar54 = vaddps_avx512vl(auVar47,auVar55);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar48,auVar59);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar47,auVar59);
  auVar55 = vxorps_avx512vl(auVar55,auVar55);
  auVar55 = vfmadd213ps_avx512vl(auVar55,auVar44,auVar46);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar43,auVar89._0_16_);
  auVar37 = vfmadd231ps_avx512vl(auVar55,auVar42,auVar89._0_16_);
  auVar55 = vmulps_avx512vl(auVar46,auVar59);
  auVar55 = vfnmadd231ps_avx512vl(auVar55,auVar59,auVar44);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar89._0_16_,auVar43);
  auVar42 = vfnmadd231ps_avx512vl(auVar55,auVar89._0_16_,auVar42);
  auVar55 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar70,auVar52);
  auVar55 = vfmadd231ps_avx512vl(auVar55,auVar48,auVar89._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar55,auVar47,auVar89._0_16_);
  auVar52 = vmulps_avx512vl(auVar52,auVar59);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar59,auVar70);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar89._0_16_,auVar48);
  auVar44 = vfnmadd231ps_avx512vl(auVar52,auVar89._0_16_,auVar47);
  auVar52 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar55 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  fVar223 = auVar56._0_4_;
  auVar240._0_4_ = fVar223 * auVar55._0_4_;
  fVar207 = auVar56._4_4_;
  auVar240._4_4_ = fVar207 * auVar55._4_4_;
  fVar218 = auVar56._8_4_;
  auVar240._8_4_ = fVar218 * auVar55._8_4_;
  fVar219 = auVar56._12_4_;
  auVar240._12_4_ = fVar219 * auVar55._12_4_;
  auVar55 = vfmsub231ps_avx512vl(auVar240,auVar52,auVar54);
  auVar55 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar54 = vshufps_avx512vl(auVar50,auVar50,0xc9);
  auVar247._0_4_ = fVar223 * auVar54._0_4_;
  auVar247._4_4_ = fVar207 * auVar54._4_4_;
  auVar247._8_4_ = fVar218 * auVar54._8_4_;
  auVar247._12_4_ = fVar219 * auVar54._12_4_;
  auVar52 = vfmsub231ps_avx512vl(auVar247,auVar52,auVar50);
  auVar54 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar50 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar52 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar52 = vmulps_avx512vl(auVar42,auVar52);
  auVar52 = vfmsub231ps_avx512vl(auVar52,auVar50,auVar43);
  auVar43 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar46 = vshufps_avx512vl(auVar44,auVar44,0xc9);
  auVar52 = vdpps_avx(auVar55,auVar55,0x7f);
  auVar46 = vmulps_avx512vl(auVar42,auVar46);
  auVar50 = vfmsub231ps_avx512vl(auVar46,auVar50,auVar44);
  auVar44 = vshufps_avx512vl(auVar50,auVar50,0xc9);
  auVar91._16_16_ = auVar109._16_16_;
  auVar91._0_16_ = auVar89._0_16_;
  auVar108._4_28_ = auVar91._4_28_;
  auVar108._0_4_ = auVar52._0_4_;
  auVar50 = vrsqrt14ss_avx512f(auVar89._0_16_,auVar108._0_16_);
  auVar46 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar47 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  auVar47 = vmulss_avx512f(auVar47,auVar50);
  auVar50 = vmulss_avx512f(auVar50,auVar50);
  auVar50 = vmulss_avx512f(auVar47,auVar50);
  auVar50 = vsubss_avx512f(auVar46,auVar50);
  auVar46 = vbroadcastss_avx512vl(auVar50);
  auVar47 = vmulps_avx512vl(auVar55,auVar46);
  auVar50 = vdpps_avx(auVar55,auVar54,0x7f);
  auVar48 = vbroadcastss_avx512vl(auVar52);
  auVar54 = vmulps_avx512vl(auVar48,auVar54);
  fVar152 = auVar50._0_4_;
  auVar153._0_4_ = auVar55._0_4_ * fVar152;
  auVar153._4_4_ = auVar55._4_4_ * fVar152;
  auVar153._8_4_ = auVar55._8_4_ * fVar152;
  auVar153._12_4_ = auVar55._12_4_ * fVar152;
  auVar50 = vsubps_avx(auVar54,auVar153);
  auVar55 = vrcp14ss_avx512f(auVar89._0_16_,auVar108._0_16_);
  auVar52 = vfnmadd213ss_avx512f(auVar52,auVar55,ZEXT416(0x40000000));
  fVar152 = auVar55._0_4_ * auVar52._0_4_;
  auVar52 = vdpps_avx(auVar43,auVar43,0x7f);
  auVar67._0_4_ = fVar152 * auVar50._0_4_;
  auVar67._4_4_ = fVar152 * auVar50._4_4_;
  auVar67._8_4_ = fVar152 * auVar50._8_4_;
  auVar67._12_4_ = fVar152 * auVar50._12_4_;
  auVar55 = vmulps_avx512vl(auVar46,auVar67);
  auVar92._16_16_ = auVar109._16_16_;
  auVar92._0_16_ = auVar89._0_16_;
  auVar93._4_28_ = auVar92._4_28_;
  auVar93._0_4_ = auVar52._0_4_;
  auVar50 = vrsqrt14ss_avx512f(auVar89._0_16_,auVar93._0_16_);
  auVar54 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar52,ZEXT416(0x3f000000));
  auVar57 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar46 = vmulss_avx512f(auVar46,auVar50);
  auVar50 = vmulss_avx512f(auVar46,ZEXT416((uint)(auVar50._0_4_ * auVar50._0_4_)));
  fVar13 = auVar54._0_4_ - auVar50._0_4_;
  auVar248._0_4_ = auVar43._0_4_ * fVar13;
  auVar248._4_4_ = auVar43._4_4_ * fVar13;
  auVar248._8_4_ = auVar43._8_4_ * fVar13;
  auVar248._12_4_ = auVar43._12_4_ * fVar13;
  auVar50 = vdpps_avx(auVar43,auVar44,0x7f);
  auVar54 = vbroadcastss_avx512vl(auVar52);
  auVar54 = vmulps_avx512vl(auVar54,auVar44);
  fVar152 = auVar50._0_4_;
  auVar164._0_4_ = auVar43._0_4_ * fVar152;
  auVar164._4_4_ = auVar43._4_4_ * fVar152;
  auVar164._8_4_ = auVar43._8_4_ * fVar152;
  auVar164._12_4_ = auVar43._12_4_ * fVar152;
  auVar50 = vsubps_avx(auVar54,auVar164);
  auVar54 = vrcp14ss_avx512f(auVar89._0_16_,auVar93._0_16_);
  auVar52 = vfnmadd213ss_avx512f(auVar52,auVar54,ZEXT416(0x40000000));
  auVar263 = ZEXT464(0x3f800000);
  fVar152 = auVar52._0_4_ * auVar54._0_4_;
  auVar54 = vshufps_avx512vl(auVar39,auVar39,0xff);
  auVar43 = vmulps_avx512vl(auVar54,auVar47);
  auVar44 = vsubps_avx512vl(auVar39,auVar43);
  auVar52 = vshufps_avx(auVar56,auVar56,0xff);
  auVar52 = vmulps_avx512vl(auVar52,auVar47);
  auVar68._0_4_ = auVar52._0_4_ + auVar54._0_4_ * auVar55._0_4_;
  auVar68._4_4_ = auVar52._4_4_ + auVar54._4_4_ * auVar55._4_4_;
  auVar68._8_4_ = auVar52._8_4_ + auVar54._8_4_ * auVar55._8_4_;
  auVar68._12_4_ = auVar52._12_4_ + auVar54._12_4_ * auVar55._12_4_;
  auVar52 = vsubps_avx(auVar56,auVar68);
  auVar55 = vaddps_avx512vl(auVar39,auVar43);
  auVar54 = vshufps_avx512vl(auVar37,auVar37,0xff);
  auVar226._0_4_ = auVar54._0_4_ * auVar248._0_4_;
  auVar226._4_4_ = auVar54._4_4_ * auVar248._4_4_;
  auVar226._8_4_ = auVar54._8_4_ * auVar248._8_4_;
  auVar226._12_4_ = auVar54._12_4_ * auVar248._12_4_;
  auVar43 = vsubps_avx512vl(auVar37,auVar226);
  auVar46 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar46 = vmulps_avx512vl(auVar46,auVar248);
  auVar76._0_4_ = auVar46._0_4_ + auVar54._0_4_ * fVar13 * auVar50._0_4_ * fVar152;
  auVar76._4_4_ = auVar46._4_4_ + auVar54._4_4_ * fVar13 * auVar50._4_4_ * fVar152;
  auVar76._8_4_ = auVar46._8_4_ + auVar54._8_4_ * fVar13 * auVar50._8_4_ * fVar152;
  auVar76._12_4_ = auVar46._12_4_ + auVar54._12_4_ * fVar13 * auVar50._12_4_ * fVar152;
  auVar50 = vsubps_avx(auVar42,auVar76);
  auVar54 = vaddps_avx512vl(auVar37,auVar226);
  auVar165._0_4_ = auVar44._0_4_ + auVar52._0_4_ * 0.33333334;
  auVar165._4_4_ = auVar44._4_4_ + auVar52._4_4_ * 0.33333334;
  auVar165._8_4_ = auVar44._8_4_ + auVar52._8_4_ * 0.33333334;
  auVar165._12_4_ = auVar44._12_4_ + auVar52._12_4_ * 0.33333334;
  auVar191._0_4_ = auVar50._0_4_ * 0.33333334;
  auVar191._4_4_ = auVar50._4_4_ * 0.33333334;
  auVar191._8_4_ = auVar50._8_4_ * 0.33333334;
  auVar191._12_4_ = auVar50._12_4_ * 0.33333334;
  auVar52 = vsubps_avx(auVar43,auVar191);
  auVar69._0_4_ = auVar55._0_4_ + (fVar223 + auVar68._0_4_) * 0.33333334;
  auVar69._4_4_ = auVar55._4_4_ + (fVar207 + auVar68._4_4_) * 0.33333334;
  auVar69._8_4_ = auVar55._8_4_ + (fVar218 + auVar68._8_4_) * 0.33333334;
  auVar69._12_4_ = auVar55._12_4_ + (fVar219 + auVar68._12_4_) * 0.33333334;
  auVar77._0_4_ = (auVar42._0_4_ + auVar76._0_4_) * 0.33333334;
  auVar77._4_4_ = (auVar42._4_4_ + auVar76._4_4_) * 0.33333334;
  auVar77._8_4_ = (auVar42._8_4_ + auVar76._8_4_) * 0.33333334;
  auVar77._12_4_ = (auVar42._12_4_ + auVar76._12_4_) * 0.33333334;
  auVar50 = vsubps_avx(auVar54,auVar77);
  auVar42 = vbroadcastss_avx512vl(auVar53);
  auVar46 = vsubss_avx512f(ZEXT416(0x3f800000),auVar53);
  auVar249._0_4_ = auVar46._0_4_;
  auVar249._4_4_ = auVar249._0_4_;
  auVar249._8_4_ = auVar249._0_4_;
  auVar249._12_4_ = auVar249._0_4_;
  auVar44 = vmulps_avx512vl(auVar42,auVar44);
  auVar46 = vmulps_avx512vl(auVar42,auVar165);
  auVar52 = vmulps_avx512vl(auVar42,auVar52);
  auVar241._0_4_ = auVar42._0_4_ * auVar43._0_4_;
  auVar241._4_4_ = auVar42._4_4_ * auVar43._4_4_;
  auVar241._8_4_ = auVar42._8_4_ * auVar43._8_4_;
  auVar241._12_4_ = auVar42._12_4_ * auVar43._12_4_;
  auVar39 = vfmadd231ps_avx512vl(auVar44,auVar249,auVar45);
  auVar56 = vfmadd231ps_avx512vl(auVar46,auVar249,auVar173);
  auVar59 = vfmadd231ps_avx512vl(auVar52,auVar249,auVar58);
  auVar43 = vfmadd231ps_fma(auVar241,auVar249,auVar41);
  auVar52 = vmulps_avx512vl(auVar42,auVar55);
  auVar55 = vmulps_avx512vl(auVar42,auVar69);
  auVar50 = vmulps_avx512vl(auVar42,auVar50);
  auVar236._0_4_ = auVar42._0_4_ * auVar54._0_4_;
  auVar236._4_4_ = auVar42._4_4_ * auVar54._4_4_;
  auVar236._8_4_ = auVar42._8_4_ * auVar54._8_4_;
  auVar236._12_4_ = auVar42._12_4_ * auVar54._12_4_;
  auVar60 = vfmadd231ps_avx512vl(auVar52,auVar249,auVar40);
  auVar61 = vfmadd231ps_avx512vl(auVar55,auVar249,auVar35);
  auVar62 = vfmadd231ps_avx512vl(auVar50,auVar249,auVar36);
  auVar44 = vfmadd231ps_fma(auVar236,auVar249,auVar34);
  auVar52 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar52 = vinsertps_avx(auVar52,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar63 = vsubps_avx512vl(auVar39,auVar52);
  uVar124 = auVar63._0_4_;
  auVar71._4_4_ = uVar124;
  auVar71._0_4_ = uVar124;
  auVar71._8_4_ = uVar124;
  auVar71._12_4_ = uVar124;
  auVar50 = vshufps_avx(auVar63,auVar63,0x55);
  auVar55 = vshufps_avx(auVar63,auVar63,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar152 = pre->ray_space[k].vz.field_0.m128[0];
  fVar13 = pre->ray_space[k].vz.field_0.m128[1];
  fVar223 = pre->ray_space[k].vz.field_0.m128[2];
  fVar207 = pre->ray_space[k].vz.field_0.m128[3];
  auVar66._0_4_ = fVar152 * auVar55._0_4_;
  auVar66._4_4_ = fVar13 * auVar55._4_4_;
  auVar66._8_4_ = fVar223 * auVar55._8_4_;
  auVar66._12_4_ = fVar207 * auVar55._12_4_;
  auVar50 = vfmadd231ps_fma(auVar66,(undefined1  [16])aVar4,auVar50);
  auVar46 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar71);
  auVar64 = vsubps_avx512vl(auVar56,auVar52);
  uVar124 = auVar64._0_4_;
  auVar75._4_4_ = uVar124;
  auVar75._0_4_ = uVar124;
  auVar75._8_4_ = uVar124;
  auVar75._12_4_ = uVar124;
  auVar50 = vshufps_avx(auVar64,auVar64,0x55);
  auVar55 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar72._0_4_ = fVar152 * auVar55._0_4_;
  auVar72._4_4_ = fVar13 * auVar55._4_4_;
  auVar72._8_4_ = fVar223 * auVar55._8_4_;
  auVar72._12_4_ = fVar207 * auVar55._12_4_;
  auVar50 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar4,auVar50);
  auVar47 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar75);
  auVar65 = vsubps_avx512vl(auVar59,auVar52);
  uVar124 = auVar65._0_4_;
  auVar73._4_4_ = uVar124;
  auVar73._0_4_ = uVar124;
  auVar73._8_4_ = uVar124;
  auVar73._12_4_ = uVar124;
  auVar50 = vshufps_avx(auVar65,auVar65,0x55);
  auVar55 = vshufps_avx(auVar65,auVar65,0xaa);
  auVar180._0_4_ = auVar55._0_4_ * fVar152;
  auVar180._4_4_ = auVar55._4_4_ * fVar13;
  auVar180._8_4_ = auVar55._8_4_ * fVar223;
  auVar180._12_4_ = auVar55._12_4_ * fVar207;
  auVar50 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar4,auVar50);
  auVar48 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar73);
  auVar40 = vsubps_avx(auVar43,auVar52);
  uVar124 = auVar40._0_4_;
  auVar74._4_4_ = uVar124;
  auVar74._0_4_ = uVar124;
  auVar74._8_4_ = uVar124;
  auVar74._12_4_ = uVar124;
  auVar50 = vshufps_avx(auVar40,auVar40,0x55);
  auVar55 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar192._0_4_ = auVar55._0_4_ * fVar152;
  auVar192._4_4_ = auVar55._4_4_ * fVar13;
  auVar192._8_4_ = auVar55._8_4_ * fVar223;
  auVar192._12_4_ = auVar55._12_4_ * fVar207;
  auVar50 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar4,auVar50);
  auVar70 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar74);
  auVar66 = vsubps_avx512vl(auVar60,auVar52);
  uVar124 = auVar66._0_4_;
  auVar82._4_4_ = uVar124;
  auVar82._0_4_ = uVar124;
  auVar82._8_4_ = uVar124;
  auVar82._12_4_ = uVar124;
  auVar50 = vshufps_avx(auVar66,auVar66,0x55);
  auVar55 = vshufps_avx(auVar66,auVar66,0xaa);
  auVar202._0_4_ = auVar55._0_4_ * fVar152;
  auVar202._4_4_ = auVar55._4_4_ * fVar13;
  auVar202._8_4_ = auVar55._8_4_ * fVar223;
  auVar202._12_4_ = auVar55._12_4_ * fVar207;
  auVar50 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar4,auVar50);
  auVar53 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar82);
  auVar67 = vsubps_avx512vl(auVar61,auVar52);
  uVar124 = auVar67._0_4_;
  auVar80._4_4_ = uVar124;
  auVar80._0_4_ = uVar124;
  auVar80._8_4_ = uVar124;
  auVar80._12_4_ = uVar124;
  auVar50 = vshufps_avx(auVar67,auVar67,0x55);
  auVar55 = vshufps_avx(auVar67,auVar67,0xaa);
  auVar208._0_4_ = auVar55._0_4_ * fVar152;
  auVar208._4_4_ = auVar55._4_4_ * fVar13;
  auVar208._8_4_ = auVar55._8_4_ * fVar223;
  auVar208._12_4_ = auVar55._12_4_ * fVar207;
  auVar50 = vfmadd231ps_fma(auVar208,(undefined1  [16])aVar4,auVar50);
  auVar34 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar80);
  auVar68 = vsubps_avx512vl(auVar62,auVar52);
  uVar124 = auVar68._0_4_;
  auVar87._4_4_ = uVar124;
  auVar87._0_4_ = uVar124;
  auVar87._8_4_ = uVar124;
  auVar87._12_4_ = uVar124;
  auVar50 = vshufps_avx(auVar68,auVar68,0x55);
  auVar55 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar227._0_4_ = auVar55._0_4_ * fVar152;
  auVar227._4_4_ = auVar55._4_4_ * fVar13;
  auVar227._8_4_ = auVar55._8_4_ * fVar223;
  auVar227._12_4_ = auVar55._12_4_ * fVar207;
  auVar50 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar4,auVar50);
  auVar35 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar87);
  auVar41 = vsubps_avx(auVar44,auVar52);
  uVar124 = auVar41._0_4_;
  auVar130._4_4_ = uVar124;
  auVar130._0_4_ = uVar124;
  auVar130._8_4_ = uVar124;
  auVar130._12_4_ = uVar124;
  auVar52 = vshufps_avx(auVar41,auVar41,0x55);
  auVar50 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar166._0_4_ = fVar152 * auVar50._0_4_;
  auVar166._4_4_ = fVar13 * auVar50._4_4_;
  auVar166._8_4_ = fVar223 * auVar50._8_4_;
  auVar166._12_4_ = fVar207 * auVar50._12_4_;
  auVar52 = vfmadd231ps_fma(auVar166,(undefined1  [16])aVar4,auVar52);
  auVar37 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar3,auVar130);
  auVar55 = vmovlhps_avx(auVar46,auVar53);
  auVar54 = vmovlhps_avx(auVar47,auVar34);
  auVar58 = vmovlhps_avx(auVar48,auVar35);
  auVar42 = vmovlhps_avx512f(auVar70,auVar37);
  auVar50 = vminps_avx(auVar55,auVar54);
  auVar52 = vmaxps_avx(auVar55,auVar54);
  auVar45 = vminps_avx512vl(auVar58,auVar42);
  auVar50 = vminps_avx(auVar50,auVar45);
  auVar45 = vmaxps_avx512vl(auVar58,auVar42);
  auVar52 = vmaxps_avx(auVar52,auVar45);
  auVar45 = vshufpd_avx(auVar50,auVar50,3);
  auVar50 = vminps_avx(auVar50,auVar45);
  auVar45 = vshufpd_avx(auVar52,auVar52,3);
  auVar52 = vmaxps_avx(auVar52,auVar45);
  auVar50 = vandps_avx512vl(auVar50,auVar262._0_16_);
  auVar52 = vandps_avx512vl(auVar52,auVar262._0_16_);
  auVar52 = vmaxps_avx(auVar50,auVar52);
  auVar50 = vmovshdup_avx(auVar52);
  auVar52 = vmaxss_avx(auVar50,auVar52);
  lVar25 = uVar26 + 0xf;
  fVar13 = auVar52._0_4_ * 9.536743e-07;
  auVar69 = vmovddup_avx512vl(auVar46);
  auVar47 = vmovddup_avx512vl(auVar47);
  auVar181._0_8_ = auVar48._0_8_;
  auVar181._8_8_ = auVar181._0_8_;
  auVar193._0_8_ = auVar70._0_8_;
  auVar193._8_8_ = auVar193._0_8_;
  auVar89 = vbroadcastss_avx512vl(ZEXT416((uint)fVar13));
  auVar52 = vxorps_avx512vl(auVar89._0_16_,auVar57);
  auVar90 = vbroadcastss_avx512vl(auVar52);
  bVar28 = false;
  uVar21 = 0;
  fVar152 = *(float *)(ray + k * 4 + 0x30);
  auVar52 = vsubps_avx(auVar54,auVar55);
  auVar50 = vsubps_avx(auVar58,auVar54);
  auVar48 = vsubps_avx512vl(auVar42,auVar58);
  auVar70 = vsubps_avx512vl(auVar60,auVar39);
  auVar57 = vsubps_avx512vl(auVar61,auVar56);
  auVar71 = vsubps_avx512vl(auVar62,auVar59);
  auVar45 = vsubps_avx(auVar44,auVar43);
  auVar72 = vpbroadcastd_avx512vl();
  auVar46 = ZEXT816(0x3f80000000000000);
  auVar36 = auVar46;
LAB_018bef70:
  auVar109._16_16_ = vshufps_avx(auVar36,auVar36,0x50);
  auVar242._8_4_ = 0x3f800000;
  auVar242._0_8_ = 0x3f8000003f800000;
  auVar242._12_4_ = 0x3f800000;
  auVar246._16_4_ = 0x3f800000;
  auVar246._0_16_ = auVar242;
  auVar246._20_4_ = 0x3f800000;
  auVar246._24_4_ = 0x3f800000;
  auVar246._28_4_ = 0x3f800000;
  auVar130 = vsubps_avx(auVar242,auVar109._16_16_);
  fVar223 = auVar109._16_4_;
  fVar146 = auVar53._0_4_;
  auVar147._0_4_ = fVar146 * fVar223;
  fVar207 = auVar109._20_4_;
  fVar137 = auVar53._4_4_;
  auVar147._4_4_ = fVar137 * fVar207;
  fVar218 = auVar109._24_4_;
  auVar147._8_4_ = fVar146 * fVar218;
  fVar219 = auVar109._28_4_;
  auVar147._12_4_ = fVar137 * fVar219;
  fVar143 = auVar34._0_4_;
  auVar154._0_4_ = fVar143 * fVar223;
  fVar144 = auVar34._4_4_;
  auVar154._4_4_ = fVar144 * fVar207;
  auVar154._8_4_ = fVar143 * fVar218;
  auVar154._12_4_ = fVar144 * fVar219;
  fVar145 = auVar35._0_4_;
  auVar167._0_4_ = fVar145 * fVar223;
  fVar217 = auVar35._4_4_;
  auVar167._4_4_ = fVar217 * fVar207;
  auVar167._8_4_ = fVar145 * fVar218;
  auVar167._12_4_ = fVar217 * fVar219;
  fVar224 = auVar37._0_4_;
  auVar131._0_4_ = fVar224 * fVar223;
  fVar235 = auVar37._4_4_;
  auVar131._4_4_ = fVar235 * fVar207;
  auVar131._8_4_ = fVar224 * fVar218;
  auVar131._12_4_ = fVar235 * fVar219;
  auVar73 = vfmadd231ps_avx512vl(auVar147,auVar130,auVar69);
  auVar74 = vfmadd231ps_avx512vl(auVar154,auVar130,auVar47);
  auVar75 = vfmadd231ps_fma(auVar167,auVar130,auVar181);
  auVar130 = vfmadd231ps_fma(auVar131,auVar193,auVar130);
  auVar109._16_16_ = vmovshdup_avx(auVar46);
  fVar207 = auVar46._0_4_;
  fVar223 = (auVar109._16_4_ - fVar207) * 0.04761905;
  auVar151._4_4_ = fVar207;
  auVar151._0_4_ = fVar207;
  auVar151._8_4_ = fVar207;
  auVar151._12_4_ = fVar207;
  auVar151._16_4_ = fVar207;
  auVar151._20_4_ = fVar207;
  auVar151._24_4_ = fVar207;
  auVar151._28_4_ = fVar207;
  auVar99._0_8_ = auVar109._16_8_;
  auVar99._8_8_ = auVar99._0_8_;
  auVar99._16_8_ = auVar99._0_8_;
  auVar99._24_8_ = auVar99._0_8_;
  auVar109 = vsubps_avx(auVar99,auVar151);
  uVar124 = auVar73._0_4_;
  auVar111._4_4_ = uVar124;
  auVar111._0_4_ = uVar124;
  auVar111._8_4_ = uVar124;
  auVar111._12_4_ = uVar124;
  auVar111._16_4_ = uVar124;
  auVar111._20_4_ = uVar124;
  auVar111._24_4_ = uVar124;
  auVar111._28_4_ = uVar124;
  auVar100._8_4_ = 1;
  auVar100._0_8_ = 0x100000001;
  auVar100._12_4_ = 1;
  auVar100._16_4_ = 1;
  auVar100._20_4_ = 1;
  auVar100._24_4_ = 1;
  auVar100._28_4_ = 1;
  auVar108 = ZEXT1632(auVar73);
  auVar107 = vpermps_avx2(auVar100,auVar108);
  auVar91 = vbroadcastss_avx512vl(auVar74);
  auVar106 = ZEXT1632(auVar74);
  auVar92 = vpermps_avx512vl(auVar100,auVar106);
  auVar93 = vbroadcastss_avx512vl(auVar75);
  auVar102 = ZEXT1632(auVar75);
  auVar94 = vpermps_avx512vl(auVar100,auVar102);
  auVar95 = vbroadcastss_avx512vl(auVar130);
  auVar105 = ZEXT1632(auVar130);
  auVar96 = vpermps_avx512vl(auVar100,auVar105);
  auVar205._4_4_ = fVar223;
  auVar205._0_4_ = fVar223;
  auVar205._8_4_ = fVar223;
  auVar205._12_4_ = fVar223;
  auVar205._16_4_ = fVar223;
  auVar205._20_4_ = fVar223;
  auVar205._24_4_ = fVar223;
  auVar205._28_4_ = fVar223;
  auVar103._8_4_ = 2;
  auVar103._0_8_ = 0x200000002;
  auVar103._12_4_ = 2;
  auVar103._16_4_ = 2;
  auVar103._20_4_ = 2;
  auVar103._24_4_ = 2;
  auVar103._28_4_ = 2;
  auVar97 = vpermps_avx512vl(auVar103,auVar108);
  auVar98 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar99 = vpermps_avx512vl(auVar98,auVar108);
  auVar100 = vpermps_avx512vl(auVar103,auVar106);
  auVar101 = vpermps_avx512vl(auVar98,auVar106);
  auVar108 = vpermps_avx2(auVar103,auVar102);
  auVar102 = vpermps_avx512vl(auVar98,auVar102);
  auVar103 = vpermps_avx512vl(auVar103,auVar105);
  auVar104 = vpermps_avx512vl(auVar98,auVar105);
  auVar109._16_16_ = vfmadd132ps_fma(auVar109,auVar151,_DAT_01f7b040);
  auVar98 = vsubps_avx(auVar246,ZEXT1632(auVar109._16_16_));
  auVar105 = vmulps_avx512vl(auVar91,ZEXT1632(auVar109._16_16_));
  auVar110 = ZEXT1632(auVar109._16_16_);
  auVar106 = vmulps_avx512vl(auVar92,auVar110);
  auVar130 = vfmadd231ps_fma(auVar105,auVar98,auVar111);
  auVar75 = vfmadd231ps_fma(auVar106,auVar98,auVar107);
  auVar105 = vmulps_avx512vl(auVar93,auVar110);
  auVar106 = vmulps_avx512vl(auVar94,auVar110);
  auVar91 = vfmadd231ps_avx512vl(auVar105,auVar98,auVar91);
  auVar92 = vfmadd231ps_avx512vl(auVar106,auVar98,auVar92);
  auVar105 = vmulps_avx512vl(auVar95,auVar110);
  auVar111 = ZEXT1632(auVar109._16_16_);
  auVar96 = vmulps_avx512vl(auVar96,auVar111);
  auVar93 = vfmadd231ps_avx512vl(auVar105,auVar98,auVar93);
  auVar106 = vfmadd231ps_avx512vl(auVar96,auVar98,auVar94);
  fVar218 = auVar109._16_4_;
  fVar219 = auVar109._20_4_;
  auVar94._4_4_ = fVar219 * auVar91._4_4_;
  auVar94._0_4_ = fVar218 * auVar91._0_4_;
  fVar220 = auVar109._24_4_;
  auVar94._8_4_ = fVar220 * auVar91._8_4_;
  fVar221 = auVar109._28_4_;
  auVar94._12_4_ = fVar221 * auVar91._12_4_;
  auVar94._16_4_ = auVar91._16_4_ * 0.0;
  auVar94._20_4_ = auVar91._20_4_ * 0.0;
  auVar94._24_4_ = auVar91._24_4_ * 0.0;
  auVar94._28_4_ = fVar207;
  auVar96._4_4_ = fVar219 * auVar92._4_4_;
  auVar96._0_4_ = fVar218 * auVar92._0_4_;
  auVar96._8_4_ = fVar220 * auVar92._8_4_;
  auVar96._12_4_ = fVar221 * auVar92._12_4_;
  auVar96._16_4_ = auVar92._16_4_ * 0.0;
  auVar96._20_4_ = auVar92._20_4_ * 0.0;
  auVar96._24_4_ = auVar92._24_4_ * 0.0;
  auVar96._28_4_ = auVar107._28_4_;
  auVar130 = vfmadd231ps_fma(auVar94,auVar98,ZEXT1632(auVar130));
  auVar75 = vfmadd231ps_fma(auVar96,auVar98,ZEXT1632(auVar75));
  auVar110._0_4_ = fVar218 * auVar93._0_4_;
  auVar110._4_4_ = fVar219 * auVar93._4_4_;
  auVar110._8_4_ = fVar220 * auVar93._8_4_;
  auVar110._12_4_ = fVar221 * auVar93._12_4_;
  auVar110._16_4_ = auVar93._16_4_ * 0.0;
  auVar110._20_4_ = auVar93._20_4_ * 0.0;
  auVar110._24_4_ = auVar93._24_4_ * 0.0;
  auVar110._28_4_ = 0;
  auVar105._4_4_ = fVar219 * auVar106._4_4_;
  auVar105._0_4_ = fVar218 * auVar106._0_4_;
  auVar105._8_4_ = fVar220 * auVar106._8_4_;
  auVar105._12_4_ = fVar221 * auVar106._12_4_;
  auVar105._16_4_ = auVar106._16_4_ * 0.0;
  auVar105._20_4_ = auVar106._20_4_ * 0.0;
  auVar105._24_4_ = auVar106._24_4_ * 0.0;
  auVar105._28_4_ = auVar93._28_4_;
  auVar73 = vfmadd231ps_fma(auVar110,auVar98,auVar91);
  auVar74 = vfmadd231ps_fma(auVar105,auVar98,auVar92);
  auVar106._28_4_ = auVar92._28_4_;
  auVar106._0_28_ =
       ZEXT1628(CONCAT412(fVar221 * auVar74._12_4_,
                          CONCAT48(fVar220 * auVar74._8_4_,
                                   CONCAT44(fVar219 * auVar74._4_4_,fVar218 * auVar74._0_4_))));
  auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar221 * auVar73._12_4_,
                                               CONCAT48(fVar220 * auVar73._8_4_,
                                                        CONCAT44(fVar219 * auVar73._4_4_,
                                                                 fVar218 * auVar73._0_4_)))),auVar98
                            ,ZEXT1632(auVar130));
  auVar80 = vfmadd231ps_fma(auVar106,auVar98,ZEXT1632(auVar75));
  auVar107 = vsubps_avx(ZEXT1632(auVar73),ZEXT1632(auVar130));
  auVar91 = vsubps_avx(ZEXT1632(auVar74),ZEXT1632(auVar75));
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar107 = vmulps_avx512vl(auVar107,auVar92);
  auVar91 = vmulps_avx512vl(auVar91,auVar92);
  auVar160._0_4_ = fVar223 * auVar107._0_4_;
  auVar160._4_4_ = fVar223 * auVar107._4_4_;
  auVar160._8_4_ = fVar223 * auVar107._8_4_;
  auVar160._12_4_ = fVar223 * auVar107._12_4_;
  auVar160._16_4_ = fVar223 * auVar107._16_4_;
  auVar160._20_4_ = fVar223 * auVar107._20_4_;
  auVar160._24_4_ = fVar223 * auVar107._24_4_;
  auVar160._28_4_ = 0;
  auVar107 = vmulps_avx512vl(auVar205,auVar91);
  auVar75 = vxorps_avx512vl(auVar95._0_16_,auVar95._0_16_);
  auVar91 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_01fb9fc0,ZEXT1632(auVar75));
  auVar93 = vpermt2ps_avx512vl(ZEXT1632(auVar80),_DAT_01fb9fc0,ZEXT1632(auVar75));
  auVar136._0_4_ = auVar160._0_4_ + auVar82._0_4_;
  auVar136._4_4_ = auVar160._4_4_ + auVar82._4_4_;
  auVar136._8_4_ = auVar160._8_4_ + auVar82._8_4_;
  auVar136._12_4_ = auVar160._12_4_ + auVar82._12_4_;
  auVar136._16_4_ = auVar160._16_4_ + 0.0;
  auVar136._20_4_ = auVar160._20_4_ + 0.0;
  auVar136._24_4_ = auVar160._24_4_ + 0.0;
  auVar136._28_4_ = 0;
  auVar110 = ZEXT1632(auVar75);
  auVar94 = vpermt2ps_avx512vl(auVar160,_DAT_01fb9fc0,auVar110);
  auVar96 = vaddps_avx512vl(ZEXT1632(auVar80),auVar107);
  auVar105 = vpermt2ps_avx512vl(auVar107,_DAT_01fb9fc0,auVar110);
  auVar107 = vsubps_avx(auVar91,auVar94);
  auVar94 = vsubps_avx512vl(auVar93,auVar105);
  auVar105 = vmulps_avx512vl(auVar100,auVar111);
  auVar106 = vmulps_avx512vl(auVar101,auVar111);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar98,auVar97);
  auVar106 = vfmadd231ps_avx512vl(auVar106,auVar98,auVar99);
  auVar95 = vmulps_avx512vl(auVar108,auVar111);
  auVar97 = vmulps_avx512vl(auVar102,auVar111);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar100);
  auVar97 = vfmadd231ps_avx512vl(auVar97,auVar98,auVar101);
  auVar99 = vmulps_avx512vl(auVar103,auVar111);
  auVar100 = vmulps_avx512vl(auVar104,auVar111);
  auVar130 = vfmadd231ps_fma(auVar99,auVar98,auVar108);
  auVar108 = vfmadd231ps_avx512vl(auVar100,auVar98,auVar102);
  auVar99 = vmulps_avx512vl(auVar111,auVar95);
  auVar100 = ZEXT1632(auVar109._16_16_);
  auVar109 = vmulps_avx512vl(auVar100,auVar97);
  auVar105 = vfmadd231ps_avx512vl(auVar99,auVar98,auVar105);
  auVar109 = vfmadd231ps_avx512vl(auVar109,auVar98,auVar106);
  auVar108 = vmulps_avx512vl(auVar100,auVar108);
  auVar106 = vfmadd231ps_avx512vl
                       (ZEXT1632(CONCAT412(fVar221 * auVar130._12_4_,
                                           CONCAT48(fVar220 * auVar130._8_4_,
                                                    CONCAT44(fVar219 * auVar130._4_4_,
                                                             fVar218 * auVar130._0_4_)))),auVar98,
                        auVar95);
  auVar108 = vfmadd231ps_avx512vl(auVar108,auVar98,auVar97);
  auVar95._4_4_ = fVar219 * auVar106._4_4_;
  auVar95._0_4_ = fVar218 * auVar106._0_4_;
  auVar95._8_4_ = fVar220 * auVar106._8_4_;
  auVar95._12_4_ = fVar221 * auVar106._12_4_;
  auVar95._16_4_ = auVar106._16_4_ * 0.0;
  auVar95._20_4_ = auVar106._20_4_ * 0.0;
  auVar95._24_4_ = auVar106._24_4_ * 0.0;
  auVar95._28_4_ = auVar102._28_4_;
  auVar97 = vmulps_avx512vl(auVar100,auVar108);
  auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,auVar105);
  auVar99 = vfmadd231ps_avx512vl(auVar97,auVar109,auVar98);
  auVar98 = vsubps_avx512vl(auVar106,auVar105);
  auVar109 = vsubps_avx512vl(auVar108,auVar109);
  auVar98 = vmulps_avx512vl(auVar98,auVar92);
  auVar109 = vmulps_avx512vl(auVar109,auVar92);
  fVar207 = fVar223 * auVar98._0_4_;
  fVar218 = fVar223 * auVar98._4_4_;
  auVar97._4_4_ = fVar218;
  auVar97._0_4_ = fVar207;
  fVar219 = fVar223 * auVar98._8_4_;
  auVar97._8_4_ = fVar219;
  fVar220 = fVar223 * auVar98._12_4_;
  auVar97._12_4_ = fVar220;
  fVar221 = fVar223 * auVar98._16_4_;
  auVar97._16_4_ = fVar221;
  fVar222 = fVar223 * auVar98._20_4_;
  auVar97._20_4_ = fVar222;
  fVar223 = fVar223 * auVar98._24_4_;
  auVar97._24_4_ = fVar223;
  auVar97._28_4_ = auVar98._28_4_;
  auVar109 = vmulps_avx512vl(auVar205,auVar109);
  auVar108 = vpermt2ps_avx512vl(auVar95,_DAT_01fb9fc0,auVar110);
  auVar92 = vpermt2ps_avx512vl(auVar99,_DAT_01fb9fc0,auVar110);
  auVar206._0_4_ = auVar95._0_4_ + fVar207;
  auVar206._4_4_ = auVar95._4_4_ + fVar218;
  auVar206._8_4_ = auVar95._8_4_ + fVar219;
  auVar206._12_4_ = auVar95._12_4_ + fVar220;
  auVar206._16_4_ = auVar95._16_4_ + fVar221;
  auVar206._20_4_ = auVar95._20_4_ + fVar222;
  auVar206._24_4_ = auVar95._24_4_ + fVar223;
  auVar206._28_4_ = auVar95._28_4_ + auVar98._28_4_;
  auVar98 = vpermt2ps_avx512vl(auVar97,_DAT_01fb9fc0,ZEXT1632(auVar75));
  auVar105 = vaddps_avx512vl(auVar99,auVar109);
  auVar109 = vpermt2ps_avx512vl(auVar109,_DAT_01fb9fc0,ZEXT1632(auVar75));
  auVar98 = vsubps_avx(auVar108,auVar98);
  auVar106 = vsubps_avx512vl(auVar92,auVar109);
  auVar255 = ZEXT3264(auVar106);
  auVar151 = ZEXT1632(auVar82);
  auVar109 = vsubps_avx512vl(auVar95,auVar151);
  auVar160 = ZEXT1632(auVar80);
  auVar97 = vsubps_avx512vl(auVar99,auVar160);
  auVar100 = vsubps_avx512vl(auVar108,auVar91);
  auVar109 = vaddps_avx512vl(auVar109,auVar100);
  auVar100 = vsubps_avx512vl(auVar92,auVar93);
  auVar97 = vaddps_avx512vl(auVar97,auVar100);
  auVar100 = vmulps_avx512vl(auVar160,auVar109);
  auVar100 = vfnmadd231ps_avx512vl(auVar100,auVar151,auVar97);
  auVar101 = vmulps_avx512vl(auVar96,auVar109);
  auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar136,auVar97);
  auVar102 = vmulps_avx512vl(auVar94,auVar109);
  auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar107,auVar97);
  auVar103 = vmulps_avx512vl(auVar93,auVar109);
  auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar91,auVar97);
  auVar104 = vmulps_avx512vl(auVar99,auVar109);
  auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar95,auVar97);
  auVar110 = vmulps_avx512vl(auVar105,auVar109);
  auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar206,auVar97);
  auVar111 = vmulps_avx512vl(auVar106,auVar109);
  auVar111 = vfnmadd231ps_avx512vl(auVar111,auVar98,auVar97);
  auVar109 = vmulps_avx512vl(auVar92,auVar109);
  auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar108,auVar97);
  auVar97 = vminps_avx512vl(auVar100,auVar101);
  auVar100 = vmaxps_avx512vl(auVar100,auVar101);
  auVar101 = vminps_avx512vl(auVar102,auVar103);
  auVar97 = vminps_avx512vl(auVar97,auVar101);
  auVar101 = vmaxps_avx512vl(auVar102,auVar103);
  auVar100 = vmaxps_avx512vl(auVar100,auVar101);
  auVar101 = vminps_avx512vl(auVar104,auVar110);
  auVar102 = vmaxps_avx512vl(auVar104,auVar110);
  auVar103 = vminps_avx512vl(auVar111,auVar109);
  auVar101 = vminps_avx512vl(auVar101,auVar103);
  auVar97 = vminps_avx512vl(auVar97,auVar101);
  auVar109 = vmaxps_avx512vl(auVar111,auVar109);
  auVar109 = vmaxps_avx512vl(auVar102,auVar109);
  auVar100 = vmaxps_avx512vl(auVar100,auVar109);
  auVar109._16_16_ = auVar100._0_16_;
  uVar14 = vcmpps_avx512vl(auVar97,auVar89,2);
  uVar15 = vcmpps_avx512vl(auVar100,auVar90,5);
  bVar19 = (byte)uVar14 & (byte)uVar15 & 0x7f;
  if (bVar19 != 0) {
    auVar109 = vsubps_avx512vl(auVar91,auVar151);
    auVar97 = vsubps_avx512vl(auVar93,auVar160);
    auVar100 = vsubps_avx512vl(auVar108,auVar95);
    auVar100 = vaddps_avx512vl(auVar109,auVar100);
    auVar109._16_16_ = auVar100._0_16_;
    auVar101 = vsubps_avx512vl(auVar92,auVar99);
    auVar97 = vaddps_avx512vl(auVar97,auVar101);
    auVar101 = vmulps_avx512vl(auVar160,auVar100);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar97,auVar151);
    auVar96 = vmulps_avx512vl(auVar96,auVar100);
    auVar96 = vfnmadd213ps_avx512vl(auVar136,auVar97,auVar96);
    auVar94 = vmulps_avx512vl(auVar94,auVar100);
    auVar94 = vfnmadd213ps_avx512vl(auVar107,auVar97,auVar94);
    auVar107 = vmulps_avx512vl(auVar93,auVar100);
    auVar93 = vfnmadd231ps_avx512vl(auVar107,auVar97,auVar91);
    auVar107 = vmulps_avx512vl(auVar99,auVar100);
    auVar95 = vfnmadd231ps_avx512vl(auVar107,auVar97,auVar95);
    auVar107 = vmulps_avx512vl(auVar105,auVar100);
    auVar105 = vfnmadd213ps_avx512vl(auVar206,auVar97,auVar107);
    auVar107 = vmulps_avx512vl(auVar106,auVar100);
    auVar106 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar107);
    auVar98 = vmulps_avx512vl(auVar92,auVar100);
    auVar97 = vfnmadd231ps_avx512vl(auVar98,auVar108,auVar97);
    auVar107 = vminps_avx(auVar101,auVar96);
    auVar98 = vmaxps_avx(auVar101,auVar96);
    auVar91 = vminps_avx(auVar94,auVar93);
    auVar91 = vminps_avx(auVar107,auVar91);
    auVar107 = vmaxps_avx(auVar94,auVar93);
    auVar98 = vmaxps_avx(auVar98,auVar107);
    auVar108 = vminps_avx(auVar95,auVar105);
    auVar107 = vmaxps_avx(auVar95,auVar105);
    auVar92 = vminps_avx(auVar106,auVar97);
    auVar108 = vminps_avx(auVar108,auVar92);
    auVar108 = vminps_avx(auVar91,auVar108);
    auVar91 = vmaxps_avx(auVar106,auVar97);
    auVar107 = vmaxps_avx(auVar107,auVar91);
    auVar98 = vmaxps_avx(auVar98,auVar107);
    uVar14 = vcmpps_avx512vl(auVar98,auVar90,5);
    uVar15 = vcmpps_avx512vl(auVar108,auVar89,2);
    bVar19 = bVar19 & (byte)uVar14 & (byte)uVar15;
    if (bVar19 != 0) {
      mask_stack[uVar21] = (uint)bVar19;
      BVar2 = (BBox1f)vmovlps_avx(auVar46);
      cu_stack[uVar21] = BVar2;
      BVar2 = (BBox1f)vmovlps_avx(auVar36);
      cv_stack[uVar21] = BVar2;
      uVar21 = (ulong)((int)uVar21 + 1);
    }
  }
  auVar46 = vxorps_avx512vl(auVar109._16_16_,auVar109._16_16_);
  auVar256 = ZEXT1664(auVar46);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar261 = ZEXT1664(auVar46);
  auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar257 = ZEXT3264(auVar109);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar258 = ZEXT1664(auVar46);
  auVar259 = ZEXT464(0x3e2aaaab);
  auVar260 = ZEXT3264(_DAT_01fb9fe0);
  auVar109._16_16_ = DAT_01fb9fe0._16_16_;
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar264 = ZEXT1664(auVar46);
LAB_018bf46e:
  do {
    do {
      do {
        auVar130 = auVar256._0_16_;
        auVar75 = auVar261._0_16_;
        if ((int)uVar21 == 0) {
          if (bVar28) goto LAB_018c0344;
          uVar124 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar38._4_4_ = uVar124;
          auVar38._0_4_ = uVar124;
          auVar38._8_4_ = uVar124;
          auVar38._12_4_ = uVar124;
          uVar14 = vcmpps_avx512vl(auVar51,auVar38,2);
          uVar26 = (ulong)((uint)uVar26 & (uint)lVar25 & (uint)uVar14);
          goto LAB_018be47c;
        }
        uVar20 = (int)uVar21 - 1;
        uVar6 = mask_stack[uVar20];
        auVar36._8_8_ = 0;
        auVar36._0_4_ = cv_stack[uVar20].lower;
        auVar36._4_4_ = cv_stack[uVar20].upper;
        uVar33 = 0;
        for (uVar24 = (ulong)uVar6; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
          uVar33 = uVar33 + 1;
        }
        uVar23 = uVar6 - 1 & uVar6;
        bVar31 = uVar23 == 0;
        mask_stack[uVar20] = uVar23;
        if (bVar31) {
          uVar21 = (ulong)uVar20;
        }
        auVar125._8_8_ = 0;
        auVar125._0_8_ = uVar33;
        auVar46 = vpunpcklqdq_avx(auVar125,ZEXT416((int)uVar33 + 1));
        auVar46 = vcvtqq2ps_avx512vl(auVar46);
        auVar46 = vmulps_avx512vl(auVar46,auVar258._0_16_);
        fVar223 = cu_stack[uVar20].upper;
        auVar16._4_4_ = fVar223;
        auVar16._0_4_ = fVar223;
        auVar16._8_4_ = fVar223;
        auVar16._12_4_ = fVar223;
        auVar109._16_16_ = vmulps_avx512vl(auVar46,auVar16);
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar46 = vsubps_avx(auVar138,auVar46);
        fVar223 = cu_stack[uVar20].lower;
        auVar17._4_4_ = fVar223;
        auVar17._0_4_ = fVar223;
        auVar17._8_4_ = fVar223;
        auVar17._12_4_ = fVar223;
        auVar46 = vfmadd231ps_avx512vl(auVar109._16_16_,auVar46,auVar17);
        auVar109._16_16_ = vmovshdup_avx(auVar46);
        fVar223 = auVar109._16_4_ - auVar46._0_4_;
        auVar109._16_16_ = vucomiss_avx512f(ZEXT416((uint)fVar223));
        auVar259 = ZEXT1664(auVar109._16_16_);
        if (uVar6 == 0 || bVar31) goto LAB_018bef70;
        auVar109._16_16_ = vshufps_avx(auVar36,auVar36,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar223));
        auVar148._8_4_ = 0x3f800000;
        auVar148._0_8_ = 0x3f8000003f800000;
        auVar148._12_4_ = 0x3f800000;
        auVar73 = vsubps_avx(auVar148,auVar109._16_16_);
        fVar207 = auVar109._16_4_;
        auVar155._0_4_ = fVar207 * fVar146;
        fVar218 = auVar109._20_4_;
        auVar155._4_4_ = fVar218 * fVar137;
        fVar219 = auVar109._24_4_;
        auVar155._8_4_ = fVar219 * fVar146;
        fVar220 = auVar109._28_4_;
        auVar155._12_4_ = fVar220 * fVar137;
        auVar168._0_4_ = fVar207 * fVar143;
        auVar168._4_4_ = fVar218 * fVar144;
        auVar168._8_4_ = fVar219 * fVar143;
        auVar168._12_4_ = fVar220 * fVar144;
        auVar174._0_4_ = fVar207 * fVar145;
        auVar174._4_4_ = fVar218 * fVar217;
        auVar174._8_4_ = fVar219 * fVar145;
        auVar174._12_4_ = fVar220 * fVar217;
        auVar139._0_4_ = fVar207 * fVar224;
        auVar139._4_4_ = fVar218 * fVar235;
        auVar139._8_4_ = fVar219 * fVar224;
        auVar139._12_4_ = fVar220 * fVar235;
        auVar109._16_16_ = vfmadd231ps_fma(auVar155,auVar73,auVar69);
        auVar74 = vfmadd231ps_fma(auVar168,auVar73,auVar47);
        auVar82 = vfmadd231ps_fma(auVar174,auVar73,auVar181);
        auVar73 = vfmadd231ps_fma(auVar139,auVar73,auVar193);
        auVar101._16_16_ = auVar109._16_16_;
        auVar101._0_16_ = auVar109._16_16_;
        auVar102._16_16_ = auVar74;
        auVar102._0_16_ = auVar74;
        auVar172._16_16_ = auVar82;
        auVar172._0_16_ = auVar82;
        auVar107 = vpermps_avx512vl(auVar260._0_32_,ZEXT1632(auVar46));
        auVar109 = vsubps_avx(auVar102,auVar101);
        auVar74 = vfmadd213ps_fma(auVar109,auVar107,auVar101);
        auVar109 = vsubps_avx(auVar172,auVar102);
        auVar80 = vfmadd213ps_fma(auVar109,auVar107,auVar102);
        auVar109._16_16_ = vsubps_avx(auVar73,auVar82);
        auVar104._16_16_ = auVar109._16_16_;
        auVar104._0_16_ = auVar109._16_16_;
        auVar109._16_16_ = vfmadd213ps_fma(auVar104,auVar107,auVar172);
        auVar98 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar74));
        auVar73 = vfmadd213ps_fma(auVar98,auVar107,ZEXT1632(auVar74));
        auVar109 = vsubps_avx(ZEXT1632(auVar109._16_16_),ZEXT1632(auVar80));
        auVar109._16_16_ = vfmadd213ps_fma(auVar109,auVar107,ZEXT1632(auVar80));
        auVar109 = vsubps_avx(ZEXT1632(auVar109._16_16_),ZEXT1632(auVar73));
        auVar153 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar109,auVar107);
        auVar109 = vmulps_avx512vl(auVar109,auVar257._0_32_);
        auVar73 = vmulss_avx512f(ZEXT416((uint)fVar223),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar207 = auVar73._0_4_;
        auVar175._0_8_ =
             CONCAT44(auVar153._4_4_ + fVar207 * auVar109._4_4_,
                      auVar153._0_4_ + fVar207 * auVar109._0_4_);
        auVar175._8_4_ = auVar153._8_4_ + fVar207 * auVar109._8_4_;
        auVar175._12_4_ = auVar153._12_4_ + fVar207 * auVar109._12_4_;
        auVar156._0_4_ = fVar207 * auVar109._16_4_;
        auVar156._4_4_ = fVar207 * auVar109._20_4_;
        auVar156._8_4_ = fVar207 * auVar109._24_4_;
        auVar156._12_4_ = fVar207 * auVar109._28_4_;
        auVar83 = vsubps_avx((undefined1  [16])0x0,auVar156);
        auVar87 = vshufpd_avx(auVar153,auVar153,3);
        auVar84 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar73 = vsubps_avx(auVar87,auVar153);
        auVar74 = vsubps_avx(auVar84,(undefined1  [16])0x0);
        auVar194._0_4_ = auVar73._0_4_ + auVar74._0_4_;
        auVar194._4_4_ = auVar73._4_4_ + auVar74._4_4_;
        auVar194._8_4_ = auVar73._8_4_ + auVar74._8_4_;
        auVar194._12_4_ = auVar73._12_4_ + auVar74._12_4_;
        auVar73 = vshufps_avx(auVar153,auVar153,0xb1);
        auVar74 = vshufps_avx(auVar175,auVar175,0xb1);
        auVar82 = vshufps_avx(auVar83,auVar83,0xb1);
        auVar80 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar243._4_4_ = auVar194._0_4_;
        auVar243._0_4_ = auVar194._0_4_;
        auVar243._8_4_ = auVar194._0_4_;
        auVar243._12_4_ = auVar194._0_4_;
        auVar78 = vshufps_avx(auVar194,auVar194,0x55);
        fVar207 = auVar78._0_4_;
        auVar203._0_4_ = auVar73._0_4_ * fVar207;
        fVar218 = auVar78._4_4_;
        auVar203._4_4_ = auVar73._4_4_ * fVar218;
        fVar219 = auVar78._8_4_;
        auVar203._8_4_ = auVar73._8_4_ * fVar219;
        fVar220 = auVar78._12_4_;
        auVar203._12_4_ = auVar73._12_4_ * fVar220;
        auVar209._0_4_ = auVar74._0_4_ * fVar207;
        auVar209._4_4_ = auVar74._4_4_ * fVar218;
        auVar209._8_4_ = auVar74._8_4_ * fVar219;
        auVar209._12_4_ = auVar74._12_4_ * fVar220;
        auVar228._0_4_ = auVar82._0_4_ * fVar207;
        auVar228._4_4_ = auVar82._4_4_ * fVar218;
        auVar228._8_4_ = auVar82._8_4_ * fVar219;
        auVar228._12_4_ = auVar82._12_4_ * fVar220;
        auVar195._0_4_ = auVar80._0_4_ * fVar207;
        auVar195._4_4_ = auVar80._4_4_ * fVar218;
        auVar195._8_4_ = auVar80._8_4_ * fVar219;
        auVar195._12_4_ = auVar80._12_4_ * fVar220;
        auVar73 = vfmadd231ps_fma(auVar203,auVar243,auVar153);
        auVar74 = vfmadd231ps_fma(auVar209,auVar243,auVar175);
        auVar88 = vfmadd231ps_fma(auVar228,auVar243,auVar83);
        auVar81 = vfmadd231ps_fma(auVar195,(undefined1  [16])0x0,auVar243);
        auVar78 = vshufpd_avx(auVar73,auVar73,1);
        auVar79 = vshufpd_avx(auVar74,auVar74,1);
        auVar76 = vshufpd_avx512vl(auVar88,auVar88,1);
        auVar77 = vshufpd_avx512vl(auVar81,auVar81,1);
        auVar255 = ZEXT1664(auVar77);
        auVar82 = vminss_avx(auVar73,auVar74);
        auVar73 = vmaxss_avx(auVar74,auVar73);
        auVar80 = vminss_avx(auVar88,auVar81);
        auVar74 = vmaxss_avx(auVar81,auVar88);
        auVar82 = vminss_avx(auVar82,auVar80);
        auVar73 = vmaxss_avx(auVar74,auVar73);
        auVar80 = vminss_avx(auVar78,auVar79);
        auVar74 = vmaxss_avx(auVar79,auVar78);
        auVar78 = vminss_avx512f(auVar76,auVar77);
        auVar79 = vmaxss_avx512f(auVar77,auVar76);
        auVar74 = vmaxss_avx(auVar79,auVar74);
        auVar80 = vminss_avx512f(auVar80,auVar78);
        vucomiss_avx512f(auVar82);
        fVar218 = auVar74._0_4_;
        fVar207 = auVar73._0_4_;
        if (4 < (uint)uVar21) {
          bVar32 = fVar218 == -0.0001;
          bVar29 = NAN(fVar218);
          if (fVar218 <= -0.0001) goto LAB_018bf69b;
          break;
        }
LAB_018bf69b:
        auVar78 = vucomiss_avx512f(auVar80);
        bVar32 = fVar218 <= -0.0001;
        bVar30 = -0.0001 < fVar207;
        bVar29 = bVar32;
        if (!bVar32) break;
        uVar14 = vcmpps_avx512vl(auVar82,auVar78,5);
        uVar15 = vcmpps_avx512vl(auVar80,auVar78,5);
        bVar19 = (byte)uVar14 & (byte)uVar15 & 1;
        bVar32 = bVar30 && bVar19 == 0;
        bVar29 = bVar30 && bVar19 == 0;
      } while (!bVar30 || bVar19 != 0);
      vcmpss_avx512f(auVar82,auVar130,1);
      auVar88 = auVar263._0_16_;
      uVar14 = vcmpss_avx512f(auVar73,auVar130,1);
      bVar30 = (bool)((byte)uVar14 & 1);
      auVar109._0_16_ = auVar88;
      iVar123 = auVar263._0_4_;
      auVar112._4_28_ = auVar109._4_28_;
      auVar112._0_4_ = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * iVar123);
      vucomiss_avx512f(auVar112._0_16_);
      bVar29 = (bool)(!bVar32 | bVar29);
      bVar30 = bVar29 == false;
      auVar114._16_16_ = auVar109._16_16_;
      auVar114._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar113._4_28_ = auVar114._4_28_;
      auVar113._0_4_ = (uint)bVar29 * auVar256._0_4_ + (uint)!bVar29 * 0x7f800000;
      auVar79 = auVar113._0_16_;
      auVar116._16_16_ = auVar109._16_16_;
      auVar116._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar115._4_28_ = auVar116._4_28_;
      auVar115._0_4_ = (uint)bVar29 * auVar256._0_4_ + (uint)!bVar29 * -0x800000;
      auVar78 = auVar115._0_16_;
      uVar14 = vcmpss_avx512f(auVar80,auVar130,1);
      bVar32 = (bool)((byte)uVar14 & 1);
      auVar118._16_16_ = auVar109._16_16_;
      auVar118._0_16_ = auVar88;
      auVar117._4_28_ = auVar118._4_28_;
      auVar117._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar123);
      auVar80 = vucomiss_avx512f(auVar117._0_16_);
      auVar255 = ZEXT1664(auVar80);
      if ((bVar29) || (bVar30)) {
        auVar80 = vucomiss_avx512f(auVar82);
        if ((bVar29) || (bVar30)) {
          auVar81 = vxorps_avx512vl(auVar82,auVar264._0_16_);
          auVar255 = ZEXT1664(auVar81);
          auVar82 = vsubss_avx512f(auVar80,auVar82);
          auVar82 = vdivss_avx512f(auVar81,auVar82);
          auVar80 = vsubss_avx512f(auVar88,auVar82);
          auVar82 = vfmadd213ss_avx512f(auVar80,auVar130,auVar82);
          auVar80 = auVar82;
        }
        else {
          auVar80 = vxorps_avx512vl(auVar80,auVar80);
          vucomiss_avx512f(auVar80);
          if ((bVar29) || (auVar82 = auVar88, bVar30)) {
            auVar82 = SUB6416(ZEXT464(0xff800000),0);
            auVar80 = ZEXT416(0x7f800000);
          }
        }
        auVar79 = vminss_avx512f(auVar79,auVar80);
        auVar78 = vmaxss_avx(auVar82,auVar78);
      }
      uVar14 = vcmpss_avx512f(auVar74,auVar130,1);
      bVar32 = (bool)((byte)uVar14 & 1);
      fVar219 = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * iVar123);
      if ((auVar112._0_4_ != fVar219) || (NAN(auVar112._0_4_) || NAN(fVar219))) {
        if ((fVar218 != fVar207) || (NAN(fVar218) || NAN(fVar207))) {
          auVar73 = vxorps_avx512vl(auVar73,auVar264._0_16_);
          auVar196._0_4_ = auVar73._0_4_ / (fVar218 - fVar207);
          auVar196._4_12_ = auVar73._4_12_;
          auVar73 = vsubss_avx512f(auVar88,auVar196);
          auVar73 = vfmadd213ss_avx512f(auVar73,auVar130,auVar196);
          auVar74 = auVar73;
        }
        else if ((fVar207 != 0.0) ||
                (auVar73 = auVar88, auVar74 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar207))) {
          auVar73 = SUB6416(ZEXT464(0xff800000),0);
          auVar74 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar79 = vminss_avx(auVar79,auVar74);
        auVar78 = vmaxss_avx(auVar73,auVar78);
      }
      bVar32 = auVar117._0_4_ != fVar219;
      auVar73 = vminss_avx512f(auVar79,auVar88);
      auVar120._16_16_ = auVar109._16_16_;
      auVar120._0_16_ = auVar79;
      auVar119._4_28_ = auVar120._4_28_;
      auVar119._0_4_ = (uint)bVar32 * auVar73._0_4_ + (uint)!bVar32 * auVar79._0_4_;
      auVar73 = vmaxss_avx512f(auVar88,auVar78);
      auVar122._16_16_ = auVar109._16_16_;
      auVar122._0_16_ = auVar78;
      auVar121._4_28_ = auVar122._4_28_;
      auVar121._0_4_ = (uint)bVar32 * auVar73._0_4_ + (uint)!bVar32 * auVar78._0_4_;
      auVar73 = vmaxss_avx512f(auVar130,auVar119._0_16_);
      auVar74 = vminss_avx512f(auVar121._0_16_,auVar88);
    } while (auVar74._0_4_ < auVar73._0_4_);
    auVar81 = vmaxss_avx512f(auVar130,ZEXT416((uint)(auVar73._0_4_ + -0.1)));
    auVar76 = vminss_avx512f(ZEXT416((uint)(auVar74._0_4_ + 0.1)),auVar88);
    auVar140._0_8_ = auVar153._0_8_;
    auVar140._8_8_ = auVar140._0_8_;
    auVar210._8_8_ = auVar175._0_8_;
    auVar210._0_8_ = auVar175._0_8_;
    auVar229._8_8_ = auVar83._0_8_;
    auVar229._0_8_ = auVar83._0_8_;
    auVar73 = vshufpd_avx(auVar175,auVar175,3);
    auVar74 = vshufpd_avx(auVar83,auVar83,3);
    auVar82 = vshufps_avx(auVar81,auVar76,0);
    auVar244._8_4_ = 0x3f800000;
    auVar244._0_8_ = 0x3f8000003f800000;
    auVar244._12_4_ = 0x3f800000;
    auVar80 = vsubps_avx(auVar244,auVar82);
    fVar207 = auVar82._0_4_;
    auVar169._0_4_ = fVar207 * auVar87._0_4_;
    fVar218 = auVar82._4_4_;
    auVar169._4_4_ = fVar218 * auVar87._4_4_;
    fVar219 = auVar82._8_4_;
    auVar169._8_4_ = fVar219 * auVar87._8_4_;
    fVar220 = auVar82._12_4_;
    auVar169._12_4_ = fVar220 * auVar87._12_4_;
    auVar176._0_4_ = fVar207 * auVar73._0_4_;
    auVar176._4_4_ = fVar218 * auVar73._4_4_;
    auVar176._8_4_ = fVar219 * auVar73._8_4_;
    auVar176._12_4_ = fVar220 * auVar73._12_4_;
    auVar250._0_4_ = auVar74._0_4_ * fVar207;
    auVar250._4_4_ = auVar74._4_4_ * fVar218;
    auVar250._8_4_ = auVar74._8_4_ * fVar219;
    auVar250._12_4_ = auVar74._12_4_ * fVar220;
    auVar157._0_4_ = fVar207 * auVar84._0_4_;
    auVar157._4_4_ = fVar218 * auVar84._4_4_;
    auVar157._8_4_ = fVar219 * auVar84._8_4_;
    auVar157._12_4_ = fVar220 * auVar84._12_4_;
    auVar87 = vfmadd231ps_fma(auVar169,auVar80,auVar140);
    auVar84 = vfmadd231ps_fma(auVar176,auVar80,auVar210);
    auVar78 = vfmadd231ps_fma(auVar250,auVar80,auVar229);
    auVar79 = vfmadd231ps_fma(auVar157,auVar80,ZEXT816(0));
    auVar74 = vsubss_avx512f(auVar88,auVar81);
    auVar73 = vmovshdup_avx(auVar36);
    auVar153 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar81._0_4_)),auVar36,auVar74);
    auVar74 = vsubss_avx512f(auVar88,auVar76);
    auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar76._0_4_)),auVar36,auVar74);
    auVar80 = vdivss_avx512f(auVar88,ZEXT416((uint)fVar223));
    auVar36 = vsubps_avx(auVar84,auVar87);
    auVar74 = vmulps_avx512vl(auVar36,auVar75);
    auVar36 = vsubps_avx(auVar78,auVar84);
    auVar82 = vmulps_avx512vl(auVar36,auVar75);
    auVar36 = vsubps_avx(auVar79,auVar78);
    auVar36 = vmulps_avx512vl(auVar36,auVar75);
    auVar73 = vminps_avx(auVar82,auVar36);
    auVar36 = vmaxps_avx(auVar82,auVar36);
    auVar73 = vminps_avx(auVar74,auVar73);
    auVar36 = vmaxps_avx(auVar74,auVar36);
    auVar74 = vshufpd_avx(auVar73,auVar73,3);
    auVar82 = vshufpd_avx(auVar36,auVar36,3);
    auVar73 = vminps_avx(auVar73,auVar74);
    auVar36 = vmaxps_avx(auVar36,auVar82);
    fVar223 = auVar80._0_4_;
    auVar197._0_4_ = auVar73._0_4_ * fVar223;
    auVar197._4_4_ = auVar73._4_4_ * fVar223;
    auVar197._8_4_ = auVar73._8_4_ * fVar223;
    auVar197._12_4_ = auVar73._12_4_ * fVar223;
    auVar182._0_4_ = fVar223 * auVar36._0_4_;
    auVar182._4_4_ = fVar223 * auVar36._4_4_;
    auVar182._8_4_ = fVar223 * auVar36._8_4_;
    auVar182._12_4_ = fVar223 * auVar36._12_4_;
    auVar83 = vdivss_avx512f(auVar88,ZEXT416((uint)(auVar76._0_4_ - auVar153._0_4_)));
    auVar36 = vshufpd_avx(auVar87,auVar87,3);
    auVar73 = vshufpd_avx(auVar84,auVar84,3);
    auVar74 = vshufpd_avx(auVar78,auVar78,3);
    auVar82 = vshufpd_avx(auVar79,auVar79,3);
    auVar36 = vsubps_avx(auVar36,auVar87);
    auVar80 = vsubps_avx(auVar73,auVar84);
    auVar87 = vsubps_avx(auVar74,auVar78);
    auVar82 = vsubps_avx(auVar82,auVar79);
    auVar73 = vminps_avx(auVar36,auVar80);
    auVar36 = vmaxps_avx(auVar36,auVar80);
    auVar74 = vminps_avx(auVar87,auVar82);
    auVar74 = vminps_avx(auVar73,auVar74);
    auVar73 = vmaxps_avx(auVar87,auVar82);
    auVar36 = vmaxps_avx(auVar36,auVar73);
    fVar223 = auVar83._0_4_;
    auVar230._0_4_ = fVar223 * auVar74._0_4_;
    auVar230._4_4_ = fVar223 * auVar74._4_4_;
    auVar230._8_4_ = fVar223 * auVar74._8_4_;
    auVar230._12_4_ = fVar223 * auVar74._12_4_;
    auVar211._0_4_ = fVar223 * auVar36._0_4_;
    auVar211._4_4_ = fVar223 * auVar36._4_4_;
    auVar211._8_4_ = fVar223 * auVar36._8_4_;
    auVar211._12_4_ = fVar223 * auVar36._12_4_;
    auVar82 = vinsertps_avx(auVar46,auVar153,0x10);
    auVar77 = vpermt2ps_avx512vl(auVar46,_DAT_01fb9f90,auVar76);
    auVar129._0_4_ = auVar82._0_4_ + auVar77._0_4_;
    auVar129._4_4_ = auVar82._4_4_ + auVar77._4_4_;
    auVar129._8_4_ = auVar82._8_4_ + auVar77._8_4_;
    auVar129._12_4_ = auVar82._12_4_ + auVar77._12_4_;
    auVar18._8_4_ = 0x3f000000;
    auVar18._0_8_ = 0x3f0000003f000000;
    auVar18._12_4_ = 0x3f000000;
    auVar79 = vmulps_avx512vl(auVar129,auVar18);
    auVar73 = vshufps_avx(auVar79,auVar79,0x54);
    uVar124 = auVar79._0_4_;
    auVar132._4_4_ = uVar124;
    auVar132._0_4_ = uVar124;
    auVar132._8_4_ = uVar124;
    auVar132._12_4_ = uVar124;
    auVar74 = vfmadd213ps_fma(auVar52,auVar132,auVar55);
    auVar80 = vfmadd213ps_fma(auVar50,auVar132,auVar54);
    auVar87 = vfmadd213ps_fma(auVar48,auVar132,auVar58);
    auVar36 = vsubps_avx(auVar80,auVar74);
    auVar74 = vfmadd213ps_fma(auVar36,auVar132,auVar74);
    auVar36 = vsubps_avx(auVar87,auVar80);
    auVar36 = vfmadd213ps_fma(auVar36,auVar132,auVar80);
    auVar36 = vsubps_avx(auVar36,auVar74);
    auVar74 = vfmadd231ps_fma(auVar74,auVar36,auVar132);
    auVar84 = vmulps_avx512vl(auVar36,auVar75);
    auVar237._8_8_ = auVar74._0_8_;
    auVar237._0_8_ = auVar74._0_8_;
    auVar36 = vshufpd_avx(auVar74,auVar74,3);
    auVar74 = vshufps_avx(auVar79,auVar79,0x55);
    auVar80 = vsubps_avx(auVar36,auVar237);
    auVar87 = vfmadd231ps_fma(auVar237,auVar74,auVar80);
    auVar251._8_8_ = auVar84._0_8_;
    auVar251._0_8_ = auVar84._0_8_;
    auVar36 = vshufpd_avx(auVar84,auVar84,3);
    auVar36 = vsubps_avx512vl(auVar36,auVar251);
    auVar36 = vfmadd213ps_avx512vl(auVar36,auVar74,auVar251);
    auVar133._0_8_ = auVar80._0_8_ ^ 0x8000000080000000;
    auVar133._8_4_ = auVar80._8_4_ ^ 0x80000000;
    auVar133._12_4_ = auVar80._12_4_ ^ 0x80000000;
    auVar74 = vmovshdup_avx512vl(auVar36);
    auVar252._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
    auVar252._8_4_ = auVar74._8_4_ ^ 0x80000000;
    auVar252._12_4_ = auVar74._12_4_ ^ 0x80000000;
    auVar84 = vmovshdup_avx512vl(auVar80);
    auVar78 = vpermt2ps_avx512vl(auVar252,ZEXT416(5),auVar80);
    auVar74 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar74._0_4_ * auVar80._0_4_)),auVar36,auVar84);
    auVar80 = vpermt2ps_avx512vl(auVar36,SUB6416(ZEXT464(4),0),auVar133);
    auVar158._0_4_ = auVar74._0_4_;
    auVar158._4_4_ = auVar158._0_4_;
    auVar158._8_4_ = auVar158._0_4_;
    auVar158._12_4_ = auVar158._0_4_;
    auVar36 = vdivps_avx(auVar78,auVar158);
    auVar85 = vdivps_avx512vl(auVar80,auVar158);
    fVar223 = auVar87._0_4_;
    auVar74 = vshufps_avx(auVar87,auVar87,0x55);
    auVar238._0_4_ = fVar223 * auVar36._0_4_ + auVar74._0_4_ * auVar85._0_4_;
    auVar238._4_4_ = fVar223 * auVar36._4_4_ + auVar74._4_4_ * auVar85._4_4_;
    auVar238._8_4_ = fVar223 * auVar36._8_4_ + auVar74._8_4_ * auVar85._8_4_;
    auVar238._12_4_ = fVar223 * auVar36._12_4_ + auVar74._12_4_ * auVar85._12_4_;
    auVar83 = vsubps_avx(auVar73,auVar238);
    auVar74 = vmovshdup_avx(auVar36);
    auVar73 = vinsertps_avx(auVar197,auVar230,0x1c);
    auVar253._0_4_ = auVar74._0_4_ * auVar73._0_4_;
    auVar253._4_4_ = auVar74._4_4_ * auVar73._4_4_;
    auVar253._8_4_ = auVar74._8_4_ * auVar73._8_4_;
    auVar253._12_4_ = auVar74._12_4_ * auVar73._12_4_;
    auVar81 = vinsertps_avx512f(auVar182,auVar211,0x1c);
    auVar74 = vmulps_avx512vl(auVar74,auVar81);
    auVar78 = vminps_avx512vl(auVar253,auVar74);
    auVar87 = vmaxps_avx(auVar74,auVar253);
    auVar84 = vmovshdup_avx(auVar85);
    auVar74 = vinsertps_avx(auVar230,auVar197,0x4c);
    auVar231._0_4_ = auVar84._0_4_ * auVar74._0_4_;
    auVar231._4_4_ = auVar84._4_4_ * auVar74._4_4_;
    auVar231._8_4_ = auVar84._8_4_ * auVar74._8_4_;
    auVar231._12_4_ = auVar84._12_4_ * auVar74._12_4_;
    auVar80 = vinsertps_avx(auVar211,auVar182,0x4c);
    auVar212._0_4_ = auVar84._0_4_ * auVar80._0_4_;
    auVar212._4_4_ = auVar84._4_4_ * auVar80._4_4_;
    auVar212._8_4_ = auVar84._8_4_ * auVar80._8_4_;
    auVar212._12_4_ = auVar84._12_4_ * auVar80._12_4_;
    auVar84 = vminps_avx(auVar231,auVar212);
    auVar78 = vaddps_avx512vl(auVar78,auVar84);
    auVar84 = vmaxps_avx(auVar212,auVar231);
    auVar213._0_4_ = auVar87._0_4_ + auVar84._0_4_;
    auVar213._4_4_ = auVar87._4_4_ + auVar84._4_4_;
    auVar213._8_4_ = auVar87._8_4_ + auVar84._8_4_;
    auVar213._12_4_ = auVar87._12_4_ + auVar84._12_4_;
    auVar232._8_8_ = 0x3f80000000000000;
    auVar232._0_8_ = 0x3f80000000000000;
    auVar87 = vsubps_avx(auVar232,auVar213);
    auVar84 = vsubps_avx(auVar232,auVar78);
    auVar78 = vsubps_avx(auVar82,auVar79);
    auVar79 = vsubps_avx(auVar77,auVar79);
    fVar220 = auVar78._0_4_;
    auVar254._0_4_ = fVar220 * auVar87._0_4_;
    fVar221 = auVar78._4_4_;
    auVar254._4_4_ = fVar221 * auVar87._4_4_;
    fVar222 = auVar78._8_4_;
    auVar254._8_4_ = fVar222 * auVar87._8_4_;
    fVar161 = auVar78._12_4_;
    auVar254._12_4_ = fVar161 * auVar87._12_4_;
    auVar86 = vbroadcastss_avx512vl(auVar36);
    auVar73 = vmulps_avx512vl(auVar86,auVar73);
    auVar81 = vmulps_avx512vl(auVar86,auVar81);
    auVar86 = vminps_avx512vl(auVar73,auVar81);
    auVar81 = vmaxps_avx512vl(auVar81,auVar73);
    auVar73 = vbroadcastss_avx512vl(auVar85);
    auVar74 = vmulps_avx512vl(auVar73,auVar74);
    auVar73 = vmulps_avx512vl(auVar73,auVar80);
    auVar80 = vminps_avx512vl(auVar74,auVar73);
    auVar80 = vaddps_avx512vl(auVar86,auVar80);
    auVar78 = vmulps_avx512vl(auVar78,auVar84);
    auVar255 = ZEXT1664(auVar78);
    fVar223 = auVar79._0_4_;
    auVar214._0_4_ = fVar223 * auVar87._0_4_;
    fVar207 = auVar79._4_4_;
    auVar214._4_4_ = fVar207 * auVar87._4_4_;
    fVar218 = auVar79._8_4_;
    auVar214._8_4_ = fVar218 * auVar87._8_4_;
    fVar219 = auVar79._12_4_;
    auVar214._12_4_ = fVar219 * auVar87._12_4_;
    auVar233._0_4_ = fVar223 * auVar84._0_4_;
    auVar233._4_4_ = fVar207 * auVar84._4_4_;
    auVar233._8_4_ = fVar218 * auVar84._8_4_;
    auVar233._12_4_ = fVar219 * auVar84._12_4_;
    auVar73 = vmaxps_avx(auVar73,auVar74);
    auVar183._0_4_ = auVar81._0_4_ + auVar73._0_4_;
    auVar183._4_4_ = auVar81._4_4_ + auVar73._4_4_;
    auVar183._8_4_ = auVar81._8_4_ + auVar73._8_4_;
    auVar183._12_4_ = auVar81._12_4_ + auVar73._12_4_;
    auVar198._8_8_ = 0x3f800000;
    auVar198._0_8_ = 0x3f800000;
    auVar73 = vsubps_avx(auVar198,auVar183);
    auVar74 = vsubps_avx512vl(auVar198,auVar80);
    auVar245._0_4_ = fVar220 * auVar73._0_4_;
    auVar245._4_4_ = fVar221 * auVar73._4_4_;
    auVar245._8_4_ = fVar222 * auVar73._8_4_;
    auVar245._12_4_ = fVar161 * auVar73._12_4_;
    auVar239._0_4_ = fVar220 * auVar74._0_4_;
    auVar239._4_4_ = fVar221 * auVar74._4_4_;
    auVar239._8_4_ = fVar222 * auVar74._8_4_;
    auVar239._12_4_ = fVar161 * auVar74._12_4_;
    auVar184._0_4_ = fVar223 * auVar73._0_4_;
    auVar184._4_4_ = fVar207 * auVar73._4_4_;
    auVar184._8_4_ = fVar218 * auVar73._8_4_;
    auVar184._12_4_ = fVar219 * auVar73._12_4_;
    auVar199._0_4_ = fVar223 * auVar74._0_4_;
    auVar199._4_4_ = fVar207 * auVar74._4_4_;
    auVar199._8_4_ = fVar218 * auVar74._8_4_;
    auVar199._12_4_ = fVar219 * auVar74._12_4_;
    auVar73 = vminps_avx(auVar245,auVar239);
    auVar74 = vminps_avx512vl(auVar184,auVar199);
    auVar80 = vminps_avx512vl(auVar73,auVar74);
    auVar73 = vmaxps_avx(auVar239,auVar245);
    auVar74 = vmaxps_avx(auVar199,auVar184);
    auVar74 = vmaxps_avx(auVar74,auVar73);
    auVar87 = vminps_avx512vl(auVar254,auVar78);
    auVar73 = vminps_avx(auVar214,auVar233);
    auVar73 = vminps_avx(auVar87,auVar73);
    auVar73 = vhaddps_avx(auVar80,auVar73);
    auVar87 = vmaxps_avx512vl(auVar78,auVar254);
    auVar80 = vmaxps_avx(auVar233,auVar214);
    auVar80 = vmaxps_avx(auVar80,auVar87);
    auVar74 = vhaddps_avx(auVar74,auVar80);
    auVar73 = vshufps_avx(auVar73,auVar73,0xe8);
    auVar74 = vshufps_avx(auVar74,auVar74,0xe8);
    auVar185._0_4_ = auVar73._0_4_ + auVar83._0_4_;
    auVar185._4_4_ = auVar73._4_4_ + auVar83._4_4_;
    auVar185._8_4_ = auVar73._8_4_ + auVar83._8_4_;
    auVar185._12_4_ = auVar73._12_4_ + auVar83._12_4_;
    auVar200._0_4_ = auVar74._0_4_ + auVar83._0_4_;
    auVar200._4_4_ = auVar74._4_4_ + auVar83._4_4_;
    auVar200._8_4_ = auVar74._8_4_ + auVar83._8_4_;
    auVar200._12_4_ = auVar74._12_4_ + auVar83._12_4_;
    auVar73 = vmaxps_avx(auVar82,auVar185);
    auVar74 = vminps_avx(auVar200,auVar77);
    uVar33 = vcmpps_avx512vl(auVar74,auVar73,1);
  } while ((uVar33 & 3) != 0);
  uVar33 = vcmpps_avx512vl(auVar200,auVar77,1);
  uVar14 = vcmpps_avx512vl(auVar46,auVar185,1);
  if (((ushort)uVar14 & (ushort)uVar33 & 1) == 0) {
    bVar19 = 0;
  }
  else {
    auVar73 = vmovshdup_avx(auVar185);
    bVar19 = auVar153._0_4_ < auVar73._0_4_ & (byte)(uVar33 >> 1) & 0x7f;
  }
  p03.field_0.i[0] = auVar42._0_4_;
  p03.field_0.i[1] = auVar42._4_4_;
  p03.field_0.i[2] = auVar42._8_4_;
  p03.field_0.i[3] = auVar42._12_4_;
  if (((3 < (uint)uVar21 || uVar6 != 0 && !bVar31) | bVar19) != 1) goto LAB_018c02cf;
  lVar22 = 0xc9;
  do {
    lVar22 = lVar22 + -1;
    if (lVar22 == 0) goto LAB_018bf46e;
    auVar46 = vsubss_avx512f(auVar88,auVar83);
    fVar218 = auVar46._0_4_;
    fVar223 = fVar218 * fVar218 * fVar218;
    auVar46 = vmulss_avx512f(auVar83,ZEXT416(0x40400000));
    fVar207 = auVar46._0_4_ * fVar218 * fVar218;
    fVar219 = auVar83._0_4_;
    auVar46 = vmulss_avx512f(ZEXT416((uint)(fVar219 * fVar219)),ZEXT416(0x40400000));
    fVar218 = fVar218 * auVar46._0_4_;
    auVar149._4_4_ = fVar223;
    auVar149._0_4_ = fVar223;
    auVar149._8_4_ = fVar223;
    auVar149._12_4_ = fVar223;
    auVar141._4_4_ = fVar207;
    auVar141._0_4_ = fVar207;
    auVar141._8_4_ = fVar207;
    auVar141._12_4_ = fVar207;
    auVar126._4_4_ = fVar218;
    auVar126._0_4_ = fVar218;
    auVar126._8_4_ = fVar218;
    auVar126._12_4_ = fVar218;
    fVar219 = fVar219 * fVar219 * fVar219;
    auVar170._0_4_ = p03.field_0.v[0] * fVar219;
    auVar170._4_4_ = p03.field_0.v[1] * fVar219;
    auVar170._8_4_ = p03.field_0.v[2] * fVar219;
    auVar170._12_4_ = p03.field_0.v[3] * fVar219;
    auVar46 = vfmadd231ps_fma(auVar170,auVar58,auVar126);
    auVar46 = vfmadd231ps_fma(auVar46,auVar54,auVar141);
    auVar46 = vfmadd231ps_fma(auVar46,auVar55,auVar149);
    auVar127._8_8_ = auVar46._0_8_;
    auVar127._0_8_ = auVar46._0_8_;
    auVar46 = vshufpd_avx(auVar46,auVar46,3);
    auVar73 = vshufps_avx(auVar83,auVar83,0x55);
    auVar46 = vsubps_avx(auVar46,auVar127);
    auVar73 = vfmadd213ps_fma(auVar46,auVar73,auVar127);
    fVar223 = auVar73._0_4_;
    auVar46 = vshufps_avx(auVar73,auVar73,0x55);
    auVar128._0_4_ = auVar36._0_4_ * fVar223 + auVar85._0_4_ * auVar46._0_4_;
    auVar128._4_4_ = auVar36._4_4_ * fVar223 + auVar85._4_4_ * auVar46._4_4_;
    auVar128._8_4_ = auVar36._8_4_ * fVar223 + auVar85._8_4_ * auVar46._8_4_;
    auVar128._12_4_ = auVar36._12_4_ * fVar223 + auVar85._12_4_ * auVar46._12_4_;
    auVar83 = vsubps_avx(auVar83,auVar128);
    auVar46 = vandps_avx512vl(auVar73,auVar262._0_16_);
    auVar73 = vprolq_avx512vl(auVar46,0x20);
    auVar46 = vmaxss_avx(auVar73,auVar46);
    bVar31 = fVar13 < auVar46._0_4_;
  } while (fVar13 <= auVar46._0_4_);
  auVar46 = vucomiss_avx512f(auVar130);
  if (bVar31) goto LAB_018bf46e;
  auVar36 = vucomiss_avx512f(auVar46);
  auVar263 = ZEXT1664(auVar36);
  if (bVar31) goto LAB_018bf46e;
  vmovshdup_avx(auVar46);
  auVar36 = vucomiss_avx512f(auVar130);
  if (bVar31) goto LAB_018bf46e;
  auVar73 = vucomiss_avx512f(auVar36);
  auVar263 = ZEXT1664(auVar73);
  if (bVar31) goto LAB_018bf46e;
  auVar74 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar83 = vinsertps_avx(auVar74,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar74 = vdpps_avx(auVar83,auVar63,0x7f);
  auVar82 = vdpps_avx(auVar83,auVar64,0x7f);
  auVar80 = vdpps_avx(auVar83,auVar65,0x7f);
  auVar87 = vdpps_avx(auVar83,auVar40,0x7f);
  auVar84 = vdpps_avx(auVar83,auVar66,0x7f);
  auVar78 = vdpps_avx(auVar83,auVar67,0x7f);
  auVar79 = vdpps_avx(auVar83,auVar68,0x7f);
  auVar83 = vdpps_avx(auVar83,auVar41,0x7f);
  auVar88 = vsubss_avx512f(auVar73,auVar36);
  fVar223 = auVar36._0_4_;
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar84._0_4_)),auVar88,auVar74);
  auVar74 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ * fVar223)),auVar88,auVar82);
  auVar82 = vfmadd231ss_fma(ZEXT416((uint)(auVar79._0_4_ * fVar223)),auVar88,auVar80);
  auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar223 * auVar83._0_4_)),auVar88,auVar87);
  auVar73 = vsubss_avx512f(auVar73,auVar46);
  auVar177._0_4_ = auVar73._0_4_;
  fVar223 = auVar177._0_4_ * auVar177._0_4_ * auVar177._0_4_;
  auVar73 = vmulss_avx512f(auVar46,ZEXT416(0x40400000));
  fVar207 = auVar73._0_4_ * auVar177._0_4_ * auVar177._0_4_;
  local_b8 = auVar46._0_4_;
  auVar159._0_4_ = local_b8 * local_b8;
  auVar159._4_4_ = auVar46._4_4_ * auVar46._4_4_;
  auVar159._8_4_ = auVar46._8_4_ * auVar46._8_4_;
  auVar159._12_4_ = auVar46._12_4_ * auVar46._12_4_;
  auVar73 = vmulss_avx512f(auVar159,ZEXT416(0x40400000));
  fVar218 = auVar177._0_4_ * auVar73._0_4_;
  fVar220 = local_b8 * auVar159._0_4_;
  auVar73 = vfmadd231ss_fma(ZEXT416((uint)(fVar220 * auVar80._0_4_)),ZEXT416((uint)fVar218),auVar82)
  ;
  auVar73 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar207),auVar74);
  auVar36 = vfmadd231ss_fma(auVar73,ZEXT416((uint)fVar223),auVar36);
  fVar219 = auVar36._0_4_;
  if ((fVar219 < fVar152) || (fVar221 = *(float *)(ray + k * 4 + 0x80), fVar221 < fVar219))
  goto LAB_018bf46e;
  local_a8 = vshufps_avx(auVar46,auVar46,0x55);
  auVar186._8_4_ = 0x3f800000;
  auVar186._0_8_ = 0x3f8000003f800000;
  auVar186._12_4_ = 0x3f800000;
  auVar46 = vsubps_avx(auVar186,local_a8);
  local_268 = auVar60._0_4_;
  fStack_264 = auVar60._4_4_;
  fStack_260 = auVar60._8_4_;
  fStack_25c = auVar60._12_4_;
  fVar222 = local_a8._0_4_;
  auVar201._0_4_ = fVar222 * local_268;
  fVar161 = local_a8._4_4_;
  auVar201._4_4_ = fVar161 * fStack_264;
  fVar162 = local_a8._8_4_;
  auVar201._8_4_ = fVar162 * fStack_260;
  fVar163 = local_a8._12_4_;
  auVar201._12_4_ = fVar163 * fStack_25c;
  local_278 = auVar61._0_4_;
  fStack_274 = auVar61._4_4_;
  fStack_270 = auVar61._8_4_;
  fStack_26c = auVar61._12_4_;
  auVar204._0_4_ = fVar222 * local_278;
  auVar204._4_4_ = fVar161 * fStack_274;
  auVar204._8_4_ = fVar162 * fStack_270;
  auVar204._12_4_ = fVar163 * fStack_26c;
  local_288 = auVar62._0_4_;
  fStack_284 = auVar62._4_4_;
  fStack_280 = auVar62._8_4_;
  fStack_27c = auVar62._12_4_;
  auVar215._0_4_ = fVar222 * local_288;
  auVar215._4_4_ = fVar161 * fStack_284;
  auVar215._8_4_ = fVar162 * fStack_280;
  auVar215._12_4_ = fVar163 * fStack_27c;
  local_298 = auVar44._0_4_;
  fStack_294 = auVar44._4_4_;
  fStack_290 = auVar44._8_4_;
  fStack_28c = auVar44._12_4_;
  auVar234._0_4_ = fVar222 * local_298;
  auVar234._4_4_ = fVar161 * fStack_294;
  auVar234._8_4_ = fVar162 * fStack_290;
  auVar234._12_4_ = fVar163 * fStack_28c;
  auVar36 = vfmadd231ps_fma(auVar201,auVar46,auVar39);
  auVar73 = vfmadd231ps_fma(auVar204,auVar46,auVar56);
  auVar74 = vfmadd231ps_fma(auVar215,auVar46,auVar59);
  auVar82 = vfmadd231ps_fma(auVar234,auVar46,auVar43);
  auVar46 = vsubps_avx(auVar73,auVar36);
  auVar36 = vsubps_avx(auVar74,auVar73);
  auVar73 = vsubps_avx(auVar82,auVar74);
  auVar216._0_4_ = auVar36._0_4_ * local_b8;
  auVar216._4_4_ = auVar36._4_4_ * local_b8;
  auVar216._8_4_ = auVar36._8_4_ * local_b8;
  auVar216._12_4_ = auVar36._12_4_ * local_b8;
  auVar177._4_4_ = auVar177._0_4_;
  auVar177._8_4_ = auVar177._0_4_;
  auVar177._12_4_ = auVar177._0_4_;
  auVar46 = vfmadd231ps_fma(auVar216,auVar177,auVar46);
  auVar187._0_4_ = auVar73._0_4_ * local_b8;
  auVar187._4_4_ = auVar73._4_4_ * local_b8;
  auVar187._8_4_ = auVar73._8_4_ * local_b8;
  auVar187._12_4_ = auVar73._12_4_ * local_b8;
  auVar36 = vfmadd231ps_fma(auVar187,auVar177,auVar36);
  auVar188._0_4_ = auVar36._0_4_ * local_b8;
  auVar188._4_4_ = auVar36._4_4_ * local_b8;
  auVar188._8_4_ = auVar36._8_4_ * local_b8;
  auVar188._12_4_ = auVar36._12_4_ * local_b8;
  auVar46 = vfmadd231ps_fma(auVar188,auVar177,auVar46);
  auVar46 = vmulps_avx512vl(auVar46,auVar75);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar19 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_018c02c4;
    local_2f8 = auVar45._0_4_;
    fStack_2f4 = auVar45._4_4_;
    fStack_2f0 = auVar45._8_4_;
    fStack_2ec = auVar45._12_4_;
    auVar171._0_4_ = fVar220 * local_2f8;
    auVar171._4_4_ = fVar220 * fStack_2f4;
    auVar171._8_4_ = fVar220 * fStack_2f0;
    auVar171._12_4_ = fVar220 * fStack_2ec;
    auVar150._4_4_ = fVar218;
    auVar150._0_4_ = fVar218;
    auVar150._8_4_ = fVar218;
    auVar150._12_4_ = fVar218;
    auVar36 = vfmadd132ps_fma(auVar150,auVar171,auVar71);
    auVar142._4_4_ = fVar207;
    auVar142._0_4_ = fVar207;
    auVar142._8_4_ = fVar207;
    auVar142._12_4_ = fVar207;
    auVar36 = vfmadd132ps_fma(auVar142,auVar36,auVar57);
    auVar134._4_4_ = fVar223;
    auVar134._0_4_ = fVar223;
    auVar134._8_4_ = fVar223;
    auVar134._12_4_ = fVar223;
    auVar73 = vfmadd132ps_fma(auVar134,auVar36,auVar70);
    auVar36 = vshufps_avx(auVar73,auVar73,0xc9);
    auVar75 = vshufps_avx(auVar46,auVar46,0xc9);
    auVar135._0_4_ = auVar73._0_4_ * auVar75._0_4_;
    auVar135._4_4_ = auVar73._4_4_ * auVar75._4_4_;
    auVar135._8_4_ = auVar73._8_4_ * auVar75._8_4_;
    auVar135._12_4_ = auVar73._12_4_ * auVar75._12_4_;
    auVar36 = vfmsub231ps_fma(auVar135,auVar46,auVar36);
    auVar46 = vshufps_avx(auVar36,auVar36,0x55);
    local_d8 = vshufps_avx(auVar36,auVar36,0xaa);
    local_c8 = auVar36._0_4_;
    local_e8[0] = (RTCHitN)auVar46[0];
    local_e8[1] = (RTCHitN)auVar46[1];
    local_e8[2] = (RTCHitN)auVar46[2];
    local_e8[3] = (RTCHitN)auVar46[3];
    local_e8[4] = (RTCHitN)auVar46[4];
    local_e8[5] = (RTCHitN)auVar46[5];
    local_e8[6] = (RTCHitN)auVar46[6];
    local_e8[7] = (RTCHitN)auVar46[7];
    local_e8[8] = (RTCHitN)auVar46[8];
    local_e8[9] = (RTCHitN)auVar46[9];
    local_e8[10] = (RTCHitN)auVar46[10];
    local_e8[0xb] = (RTCHitN)auVar46[0xb];
    local_e8[0xc] = (RTCHitN)auVar46[0xc];
    local_e8[0xd] = (RTCHitN)auVar46[0xd];
    local_e8[0xe] = (RTCHitN)auVar46[0xe];
    local_e8[0xf] = (RTCHitN)auVar46[0xf];
    uStack_c4 = local_c8;
    uStack_c0 = local_c8;
    uStack_bc = local_c8;
    fStack_b4 = local_b8;
    fStack_b0 = local_b8;
    fStack_ac = local_b8;
    local_2b8 = auVar38._0_8_;
    uStack_2b0 = auVar38._8_8_;
    local_98 = local_2b8;
    uStack_90 = uStack_2b0;
    local_88 = auVar72;
    vpcmpeqd_avx2(ZEXT1632(auVar72),ZEXT1632(auVar72));
    uStack_74 = context->user->instID[0];
    local_78 = uStack_74;
    uStack_70 = uStack_74;
    uStack_6c = uStack_74;
    uStack_68 = context->user->instPrimID[0];
    uStack_64 = uStack_68;
    uStack_60 = uStack_68;
    uStack_5c = uStack_68;
    *(float *)(ray + k * 4 + 0x80) = fVar219;
    args.valid = (int *)local_378;
    args.geometryUserPtr = pGVar7->userPtr;
    args.context = context->user;
    args.ray = (RTCRayN *)ray;
    args.hit = local_e8;
    args.N = 4;
    local_378 = auVar49;
    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      local_368 = lVar25;
      (*pGVar7->occlusionFilterN)(&args);
      auVar260 = ZEXT3264(_DAT_01fb9fe0);
      auVar259 = ZEXT464(0x3e2aaaab);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar258 = ZEXT1664(auVar46);
      auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar257 = ZEXT3264(auVar109);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar264 = ZEXT1664(auVar46);
      auVar263 = ZEXT464(0x3f800000);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar261 = ZEXT1664(auVar46);
      auVar46 = vxorps_avx512vl(auVar130,auVar130);
      auVar256 = ZEXT1664(auVar46);
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar262 = ZEXT1664(auVar46);
      lVar25 = local_368;
    }
    auVar46 = auVar256._0_16_;
    uVar33 = vptestmd_avx512vl(local_378,local_378);
    if ((uVar33 & 0xf) != 0) {
      p_Var12 = context->args->filter;
      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var12)(&args);
        auVar260 = ZEXT3264(_DAT_01fb9fe0);
        auVar259 = ZEXT464(0x3e2aaaab);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar258 = ZEXT1664(auVar36);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar257 = ZEXT3264(auVar109);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar264 = ZEXT1664(auVar36);
        auVar263 = ZEXT464(0x3f800000);
        auVar36 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar261 = ZEXT1664(auVar36);
        auVar46 = vxorps_avx512vl(auVar46,auVar46);
        auVar256 = ZEXT1664(auVar46);
        auVar46 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar262 = ZEXT1664(auVar46);
      }
      uVar33 = vptestmd_avx512vl(local_378,local_378);
      uVar33 = uVar33 & 0xf;
      auVar46 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar31 = (bool)((byte)uVar33 & 1);
      bVar32 = (bool)((byte)(uVar33 >> 1) & 1);
      bVar29 = (bool)((byte)(uVar33 >> 2) & 1);
      bVar30 = SUB81(uVar33 >> 3,0);
      *(uint *)(args.ray + 0x80) =
           (uint)bVar31 * auVar46._0_4_ | (uint)!bVar31 * *(int *)(args.ray + 0x80);
      *(uint *)(args.ray + 0x84) =
           (uint)bVar32 * auVar46._4_4_ | (uint)!bVar32 * *(int *)(args.ray + 0x84);
      *(uint *)(args.ray + 0x88) =
           (uint)bVar29 * auVar46._8_4_ | (uint)!bVar29 * *(int *)(args.ray + 0x88);
      *(uint *)(args.ray + 0x8c) =
           (uint)bVar30 * auVar46._12_4_ | (uint)!bVar30 * *(int *)(args.ray + 0x8c);
      bVar19 = 1;
      if ((byte)uVar33 != 0) goto LAB_018c02c4;
    }
    *(float *)(ray + k * 4 + 0x80) = fVar221;
  }
  bVar19 = 0;
LAB_018c02c4:
  bVar28 = (bool)(bVar28 | bVar19);
  goto LAB_018bf46e;
LAB_018c02cf:
  auVar36 = vinsertps_avx(auVar153,auVar76,0x10);
  goto LAB_018bef70;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }